

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack8.h
# Opt level: O1

void ncnn::convdw3x3s1_pack8_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  void *pvVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float *pfVar229;
  float *pfVar230;
  long lVar231;
  int iVar232;
  float *pfVar233;
  int iVar234;
  long lVar235;
  uint uVar236;
  uint uVar237;
  uint uVar238;
  long lVar239;
  float *pfVar240;
  float *pfVar241;
  float *pfVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float in_register_000012dc;
  float fVar248;
  float fVar249;
  float fVar250;
  float in_register_0000135c;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  float in_register_0000139c;
  float fVar255;
  float fVar256;
  float in_register_000013dc;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  float in_register_0000141c;
  float fVar262;
  float in_register_0000145c;
  float in_register_0000149c;
  float fVar263;
  float in_register_000014dc;
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar267;
  float in_register_0000151c;
  float fVar268;
  float fVar269;
  float in_register_0000155c;
  float in_register_0000159c;
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  
  iVar11 = bottom_blob->c;
  if (0 < (long)iVar11) {
    uVar12 = top_blob->w;
    uVar13 = top_blob->h;
    pvVar14 = _bias->data;
    lVar1 = (long)bottom_blob->w * 8 + 0x10;
    lVar231 = 0;
    do {
      if (pvVar14 == (void *)0x0) {
        fVar270 = 0.0;
        fVar271 = 0.0;
        fVar272 = 0.0;
        fVar273 = 0.0;
        fVar274 = 0.0;
        fVar275 = 0.0;
        fVar276 = 0.0;
        fVar277 = 0.0;
      }
      else {
        pfVar229 = (float *)((long)pvVar14 + lVar231 * 0x20);
        fVar270 = *pfVar229;
        fVar271 = pfVar229[1];
        fVar272 = pfVar229[2];
        fVar273 = pfVar229[3];
        fVar274 = pfVar229[4];
        fVar275 = pfVar229[5];
        fVar276 = pfVar229[6];
        fVar277 = pfVar229[7];
      }
      pfVar240 = (float *)(top_blob->cstep * lVar231 * top_blob->elemsize + (long)top_blob->data);
      pfVar241 = (float *)(kernel->w * lVar231 * kernel->elemsize + (long)kernel->data);
      pfVar233 = (float *)(bottom_blob->cstep * lVar231 * bottom_blob->elemsize +
                          (long)bottom_blob->data);
      lVar235 = (long)bottom_blob->w * bottom_blob->elemsize;
      pfVar229 = (float *)(lVar235 + (long)pfVar233);
      pfVar230 = (float *)(lVar235 * 2 + (long)pfVar233);
      uVar236 = 0;
      if (1 < (int)uVar13) {
        lVar235 = lVar235 * 3 + (long)pfVar233;
        pfVar242 = (float *)(top_blob->elemsize * (long)top_blob->w + (long)pfVar240);
        iVar234 = 0;
        do {
          if ((int)uVar12 < 4) {
            uVar236 = 0;
          }
          else {
            iVar232 = 3;
            lVar239 = 0;
            do {
              pfVar2 = (float *)((long)pfVar233 + lVar239 + 0x20);
              fVar15 = *pfVar2;
              fVar16 = pfVar2[1];
              fVar17 = pfVar2[2];
              fVar18 = pfVar2[3];
              fVar19 = pfVar2[4];
              fVar20 = pfVar2[5];
              fVar21 = pfVar2[6];
              pfVar3 = (float *)((long)pfVar233 + lVar239 + 0x40);
              fVar22 = *pfVar3;
              fVar23 = pfVar3[1];
              fVar24 = pfVar3[2];
              fVar25 = pfVar3[3];
              fVar26 = pfVar3[4];
              fVar27 = pfVar3[5];
              fVar28 = pfVar3[6];
              pfVar4 = (float *)((long)pfVar233 + lVar239 + 0x60);
              fVar29 = *pfVar4;
              fVar30 = pfVar4[1];
              fVar31 = pfVar4[2];
              fVar32 = pfVar4[3];
              fVar33 = pfVar4[4];
              fVar34 = pfVar4[5];
              fVar35 = pfVar4[6];
              fVar36 = pfVar4[7];
              pfVar4 = (float *)((long)pfVar233 + lVar239 + 0x80);
              fVar37 = *pfVar4;
              fVar38 = pfVar4[1];
              fVar39 = pfVar4[2];
              fVar40 = pfVar4[3];
              fVar41 = pfVar4[4];
              fVar42 = pfVar4[5];
              fVar43 = pfVar4[6];
              fVar44 = *pfVar241;
              fVar45 = pfVar241[1];
              fVar46 = pfVar241[2];
              fVar47 = pfVar241[3];
              fVar48 = pfVar241[4];
              fVar49 = pfVar241[5];
              fVar50 = pfVar241[6];
              fVar51 = pfVar241[8];
              fVar52 = pfVar241[9];
              fVar53 = pfVar241[10];
              fVar54 = pfVar241[0xb];
              fVar55 = pfVar241[0xc];
              fVar56 = pfVar241[0xd];
              fVar57 = pfVar241[0xe];
              fVar58 = pfVar241[0x10];
              fVar59 = pfVar241[0x11];
              fVar60 = pfVar241[0x12];
              fVar61 = pfVar241[0x13];
              fVar62 = pfVar241[0x14];
              fVar63 = pfVar241[0x15];
              fVar64 = pfVar241[0x16];
              fVar65 = pfVar241[0x18];
              fVar66 = pfVar241[0x19];
              fVar67 = pfVar241[0x1a];
              fVar68 = pfVar241[0x1b];
              fVar69 = pfVar241[0x1c];
              fVar70 = pfVar241[0x1d];
              fVar71 = pfVar241[0x1e];
              pfVar8 = (float *)((long)pfVar233 + lVar239);
              fVar72 = pfVar8[1];
              fVar73 = pfVar8[2];
              fVar74 = pfVar8[3];
              fVar75 = pfVar8[4];
              fVar76 = pfVar8[5];
              fVar77 = pfVar8[6];
              fVar243 = in_register_0000141c + fVar277 + pfVar2[7] + pfVar3[7];
              fVar244 = in_register_0000145c + fVar277 + in_register_0000151c + fVar243;
              fVar245 = in_register_0000149c + fVar277 + in_register_0000155c + fVar244;
              pfVar2 = (float *)((long)pfVar233 + lVar239 + 0xa0);
              fVar78 = *pfVar2;
              fVar79 = pfVar2[1];
              fVar80 = pfVar2[2];
              fVar81 = pfVar2[3];
              fVar82 = pfVar2[4];
              fVar83 = pfVar2[5];
              fVar84 = pfVar2[6];
              fVar246 = in_register_000014dc + fVar277 + in_register_0000159c + fVar245;
              fVar85 = pfVar241[0x20];
              fVar86 = pfVar241[0x21];
              fVar87 = pfVar241[0x22];
              fVar88 = pfVar241[0x23];
              fVar89 = pfVar241[0x24];
              fVar90 = pfVar241[0x25];
              fVar91 = pfVar241[0x26];
              pfVar2 = (float *)((long)pfVar229 + lVar239);
              fVar92 = *pfVar2;
              fVar93 = pfVar2[1];
              fVar94 = pfVar2[2];
              fVar95 = pfVar2[3];
              fVar96 = pfVar2[4];
              fVar97 = pfVar2[5];
              fVar98 = pfVar2[6];
              pfVar3 = (float *)((long)pfVar229 + lVar239 + 0x20);
              fVar99 = *pfVar3;
              fVar100 = pfVar3[1];
              fVar101 = pfVar3[2];
              fVar102 = pfVar3[3];
              fVar103 = pfVar3[4];
              fVar104 = pfVar3[5];
              fVar105 = pfVar3[6];
              fVar106 = pfVar3[7];
              pfVar3 = (float *)((long)pfVar229 + lVar239 + 0x40);
              fVar107 = *pfVar3;
              fVar108 = pfVar3[1];
              fVar109 = pfVar3[2];
              fVar110 = pfVar3[3];
              fVar111 = pfVar3[4];
              fVar112 = pfVar3[5];
              fVar113 = pfVar3[6];
              pfVar3 = (float *)((long)pfVar229 + lVar239 + 0x60);
              fVar114 = *pfVar3;
              fVar115 = pfVar3[1];
              fVar116 = pfVar3[2];
              fVar258 = pfVar3[3];
              fVar260 = pfVar3[4];
              fVar117 = pfVar3[5];
              fVar118 = pfVar3[6];
              fVar262 = in_register_0000141c + fVar277 + fVar246;
              pfVar4 = (float *)((long)pfVar229 + lVar239 + 0x80);
              fVar119 = *pfVar4;
              fVar120 = pfVar4[1];
              fVar121 = pfVar4[2];
              fVar122 = pfVar4[3];
              fVar123 = pfVar4[4];
              fVar124 = pfVar4[5];
              fVar125 = pfVar4[6];
              fVar268 = pfVar2[7] + fVar277;
              fVar264 = fVar268 + in_register_0000155c + in_register_000014dc + fVar277;
              fVar265 = fVar264 + fVar268;
              fVar257 = fVar268 + fVar277 + fVar265 + fVar268;
              pfVar2 = (float *)((long)pfVar229 + lVar239 + 0xa0);
              fVar268 = *pfVar2;
              fVar126 = pfVar2[1];
              fVar127 = pfVar2[2];
              fVar128 = pfVar2[3];
              fVar129 = pfVar2[4];
              fVar130 = pfVar2[5];
              fVar131 = pfVar2[6];
              fVar249 = pfVar241[0xf] + pfVar241[0x17];
              fVar132 = pfVar241[0x28];
              fVar133 = pfVar241[0x29];
              fVar134 = pfVar241[0x2a];
              fVar135 = pfVar241[0x2b];
              fVar136 = pfVar241[0x2c];
              fVar137 = pfVar241[0x2d];
              fVar138 = pfVar241[0x2e];
              fVar139 = pfVar241[0x2f];
              fVar251 = fVar36 + fVar246 + pfVar241[0xf];
              fVar245 = fVar246 + fVar36 + pfVar4[7] + fVar245;
              fVar247 = in_register_0000155c + fVar36 + fVar245 + fVar246;
              pfVar2 = (float *)((long)pfVar230 + lVar239);
              fVar140 = *pfVar2;
              fVar141 = pfVar2[1];
              fVar142 = pfVar2[2];
              fVar256 = pfVar2[3];
              fVar143 = pfVar2[4];
              fVar144 = pfVar2[5];
              fVar145 = pfVar2[6];
              fVar146 = pfVar2[7];
              pfVar2 = (float *)((long)pfVar230 + lVar239 + 0x20);
              fVar147 = *pfVar2;
              fVar148 = pfVar2[1];
              fVar149 = pfVar2[2];
              fVar150 = pfVar2[3];
              fVar151 = pfVar2[4];
              fVar152 = pfVar2[5];
              fVar153 = pfVar2[6];
              pfVar4 = (float *)((long)pfVar230 + lVar239 + 0x40);
              fVar154 = *pfVar4;
              fVar155 = pfVar4[1];
              fVar156 = pfVar4[2];
              fVar157 = pfVar4[3];
              fVar158 = pfVar4[4];
              fVar159 = pfVar4[5];
              fVar160 = pfVar4[6];
              fVar278 = pfVar3[7] + fVar247;
              pfVar5 = (float *)((long)pfVar230 + lVar239 + 0x60);
              fVar161 = *pfVar5;
              fVar162 = pfVar5[1];
              fVar163 = pfVar5[2];
              fVar164 = pfVar5[3];
              fVar165 = pfVar5[4];
              fVar254 = pfVar5[5];
              fVar166 = pfVar5[6];
              pfVar10 = (float *)((long)pfVar230 + lVar239 + 0x80);
              fVar167 = *pfVar10;
              fVar168 = pfVar10[1];
              fVar169 = pfVar10[2];
              fVar170 = pfVar10[3];
              fVar171 = pfVar10[4];
              fVar172 = pfVar10[5];
              fVar173 = pfVar10[6];
              fVar174 = pfVar10[7];
              fVar175 = pfVar241[0x30];
              fVar176 = pfVar241[0x31];
              fVar177 = pfVar241[0x32];
              fVar178 = pfVar241[0x33];
              fVar179 = pfVar241[0x34];
              fVar180 = pfVar241[0x35];
              fVar181 = pfVar241[0x36];
              fVar182 = pfVar241[0x37];
              fVar183 = pfVar241[0x38];
              fVar184 = pfVar241[0x39];
              fVar185 = pfVar241[0x3a];
              fVar186 = pfVar241[0x3b];
              fVar187 = pfVar241[0x3c];
              fVar188 = pfVar241[0x3d];
              fVar189 = pfVar241[0x3e];
              fVar190 = pfVar241[0x3f];
              fVar264 = fVar278 + fVar146 + fVar264;
              fVar278 = fVar278 + pfVar3[7] + fVar247;
              in_register_000013dc = fVar247 + fVar257 + fVar278 + fVar257;
              pfVar3 = (float *)((long)pfVar230 + lVar239 + 0xa0);
              fVar257 = *pfVar3;
              fVar248 = pfVar3[1];
              fVar255 = pfVar3[2];
              fVar259 = pfVar3[3];
              fVar191 = pfVar3[4];
              fVar192 = pfVar3[5];
              fVar193 = pfVar3[6];
              in_register_000012dc =
                   pfVar241[7] + fVar277 + fVar249 + fVar139 + pfVar241[0x1f] + pfVar241[0x27];
              fVar215 = pfVar241[0x40];
              fVar216 = pfVar241[0x41];
              fVar217 = pfVar241[0x42];
              fVar218 = pfVar241[0x43];
              fVar219 = pfVar241[0x44];
              fVar220 = pfVar241[0x45];
              fVar221 = pfVar241[0x46];
              in_register_0000151c = pfVar241[0x47];
              fVar252 = pfVar4[7] + fVar146 + fVar251;
              in_register_0000149c = fVar252 + fVar262 + fVar249 + fVar243;
              in_register_0000135c = pfVar2[7] + fVar146 + fVar252 + fVar251 + fVar244;
              in_register_0000141c = fVar246 + fVar36 + fVar146 + pfVar3[7] + fVar247;
              pfVar2 = (float *)(lVar235 + 0x20 + lVar239);
              fVar36 = *pfVar2;
              fVar243 = pfVar2[1];
              fVar244 = pfVar2[2];
              fVar246 = pfVar2[3];
              fVar247 = pfVar2[4];
              fVar249 = pfVar2[5];
              fVar251 = pfVar2[6];
              fVar252 = pfVar2[7];
              pfVar2 = (float *)(lVar235 + 0x40 + lVar239);
              fVar250 = *pfVar2;
              fVar253 = pfVar2[1];
              fVar261 = pfVar2[2];
              fVar263 = pfVar2[3];
              fVar266 = pfVar2[4];
              fVar267 = pfVar2[5];
              fVar269 = pfVar2[6];
              in_register_0000145c = pfVar2[7];
              pfVar2 = (float *)(lVar235 + 0x60 + lVar239);
              fVar208 = *pfVar2;
              fVar209 = pfVar2[1];
              fVar210 = pfVar2[2];
              fVar211 = pfVar2[3];
              fVar212 = pfVar2[4];
              fVar213 = pfVar2[5];
              fVar214 = pfVar2[6];
              in_register_000014dc = pfVar2[7];
              pfVar2 = (float *)(lVar235 + lVar239);
              fVar194 = *pfVar2;
              fVar195 = pfVar2[1];
              fVar196 = pfVar2[2];
              fVar197 = pfVar2[3];
              fVar198 = pfVar2[4];
              fVar199 = pfVar2[5];
              fVar200 = pfVar2[6];
              in_register_0000155c = pfVar5[7] + fVar139;
              pfVar2 = (float *)(lVar235 + 0x80 + lVar239);
              fVar222 = *pfVar2;
              fVar223 = pfVar2[1];
              fVar224 = pfVar2[2];
              fVar225 = pfVar2[3];
              fVar226 = pfVar2[4];
              fVar227 = pfVar2[5];
              fVar228 = pfVar2[6];
              in_register_0000159c = pfVar2[7];
              in_register_0000139c =
                   in_register_000013dc + in_register_0000145c + pfVar5[7] + fVar264;
              pfVar2 = (float *)(lVar235 + 0xa0 + lVar239);
              fVar201 = *pfVar2;
              fVar202 = pfVar2[1];
              fVar203 = pfVar2[2];
              fVar204 = pfVar2[3];
              fVar205 = pfVar2[4];
              fVar206 = pfVar2[5];
              fVar207 = pfVar2[6];
              pfVar2 = (float *)((long)pfVar240 + lVar239);
              *pfVar2 = fVar154 * fVar215 + fVar140 * fVar175 + fVar147 * fVar183 +
                        fVar99 * fVar85 + fVar92 * fVar65 + fVar107 * fVar132 +
                        fVar44 * *pfVar8 + fVar270 + fVar15 * fVar51 + fVar22 * fVar58;
              pfVar2[1] = fVar155 * fVar216 + fVar141 * fVar176 + fVar148 * fVar184 +
                          fVar100 * fVar86 + fVar93 * fVar66 + fVar108 * fVar133 +
                          fVar45 * fVar72 + fVar271 + fVar16 * fVar52 + fVar23 * fVar59;
              pfVar2[2] = fVar156 * fVar217 + fVar142 * fVar177 + fVar149 * fVar185 +
                          fVar101 * fVar87 + fVar94 * fVar67 + fVar109 * fVar134 +
                          fVar46 * fVar73 + fVar272 + fVar17 * fVar53 + fVar24 * fVar60;
              pfVar2[3] = fVar157 * fVar218 + fVar256 * fVar178 + fVar150 * fVar186 +
                          fVar102 * fVar88 + fVar95 * fVar68 + fVar110 * fVar135 +
                          fVar47 * fVar74 + fVar273 + fVar18 * fVar54 + fVar25 * fVar61;
              pfVar2[4] = fVar158 * fVar219 + fVar143 * fVar179 + fVar151 * fVar187 +
                          fVar103 * fVar89 + fVar96 * fVar69 + fVar111 * fVar136 +
                          fVar48 * fVar75 + fVar274 + fVar19 * fVar55 + fVar26 * fVar62;
              pfVar2[5] = fVar159 * fVar220 + fVar144 * fVar180 + fVar152 * fVar188 +
                          fVar104 * fVar90 + fVar97 * fVar70 + fVar112 * fVar137 +
                          fVar49 * fVar76 + fVar275 + fVar20 * fVar56 + fVar27 * fVar63;
              pfVar2[6] = fVar160 * fVar221 + fVar145 * fVar181 + fVar153 * fVar189 +
                          fVar105 * fVar91 + fVar98 * fVar71 + fVar113 * fVar138 +
                          fVar50 * fVar77 + fVar276 + fVar21 * fVar57 + fVar28 * fVar64;
              pfVar2[7] = in_register_0000149c;
              pfVar2 = (float *)((long)pfVar240 + lVar239 + 0x20);
              *pfVar2 = fVar154 * fVar183 + fVar147 * fVar175 + fVar161 * fVar215 +
                        fVar99 * fVar65 + fVar107 * fVar85 + fVar114 * fVar132 +
                        fVar15 * fVar44 + fVar270 + fVar22 * fVar51 + fVar29 * fVar58;
              pfVar2[1] = fVar155 * fVar184 + fVar148 * fVar176 + fVar162 * fVar216 +
                          fVar100 * fVar66 + fVar108 * fVar86 + fVar115 * fVar133 +
                          fVar16 * fVar45 + fVar271 + fVar23 * fVar52 + fVar30 * fVar59;
              pfVar2[2] = fVar156 * fVar185 + fVar149 * fVar177 + fVar163 * fVar217 +
                          fVar101 * fVar67 + fVar109 * fVar87 + fVar116 * fVar134 +
                          fVar17 * fVar46 + fVar272 + fVar24 * fVar53 + fVar31 * fVar60;
              pfVar2[3] = fVar157 * fVar186 + fVar150 * fVar178 + fVar164 * fVar218 +
                          fVar102 * fVar68 + fVar110 * fVar88 + fVar258 * fVar135 +
                          fVar18 * fVar47 + fVar273 + fVar25 * fVar54 + fVar32 * fVar61;
              pfVar2[4] = fVar158 * fVar187 + fVar151 * fVar179 + fVar165 * fVar219 +
                          fVar103 * fVar69 + fVar111 * fVar89 + fVar260 * fVar136 +
                          fVar19 * fVar48 + fVar274 + fVar26 * fVar55 + fVar33 * fVar62;
              pfVar2[5] = fVar159 * fVar188 + fVar152 * fVar180 + fVar254 * fVar220 +
                          fVar104 * fVar70 + fVar112 * fVar90 + fVar117 * fVar137 +
                          fVar20 * fVar49 + fVar275 + fVar27 * fVar56 + fVar34 * fVar63;
              pfVar2[6] = fVar160 * fVar189 + fVar153 * fVar181 + fVar166 * fVar221 +
                          fVar105 * fVar71 + fVar113 * fVar91 + fVar118 * fVar138 +
                          fVar21 * fVar50 + fVar276 + fVar28 * fVar57 + fVar35 * fVar64;
              pfVar2[7] = in_register_0000135c;
              pfVar2 = (float *)((long)pfVar240 + lVar239 + 0x40);
              *pfVar2 = fVar161 * fVar183 + fVar154 * fVar175 + fVar215 * fVar167 +
                        fVar107 * fVar65 + fVar114 * fVar85 + fVar132 * fVar119 +
                        fVar22 * fVar44 + fVar270 + fVar29 * fVar51 + fVar37 * fVar58;
              pfVar2[1] = fVar162 * fVar184 + fVar155 * fVar176 + fVar216 * fVar168 +
                          fVar108 * fVar66 + fVar115 * fVar86 + fVar133 * fVar120 +
                          fVar23 * fVar45 + fVar271 + fVar30 * fVar52 + fVar38 * fVar59;
              pfVar2[2] = fVar163 * fVar185 + fVar156 * fVar177 + fVar217 * fVar169 +
                          fVar109 * fVar67 + fVar116 * fVar87 + fVar134 * fVar121 +
                          fVar24 * fVar46 + fVar272 + fVar31 * fVar53 + fVar39 * fVar60;
              pfVar2[3] = fVar164 * fVar186 + fVar157 * fVar178 + fVar218 * fVar170 +
                          fVar110 * fVar68 + fVar258 * fVar88 + fVar135 * fVar122 +
                          fVar25 * fVar47 + fVar273 + fVar32 * fVar54 + fVar40 * fVar61;
              pfVar2[4] = fVar165 * fVar187 + fVar158 * fVar179 + fVar219 * fVar171 +
                          fVar111 * fVar69 + fVar260 * fVar89 + fVar136 * fVar123 +
                          fVar26 * fVar48 + fVar274 + fVar33 * fVar55 + fVar41 * fVar62;
              pfVar2[5] = fVar254 * fVar188 + fVar159 * fVar180 + fVar220 * fVar172 +
                          fVar112 * fVar70 + fVar117 * fVar90 + fVar137 * fVar124 +
                          fVar27 * fVar49 + fVar275 + fVar34 * fVar56 + fVar42 * fVar63;
              pfVar2[6] = fVar166 * fVar189 + fVar160 * fVar181 + fVar221 * fVar173 +
                          fVar113 * fVar71 + fVar118 * fVar91 + fVar138 * fVar125 +
                          fVar28 * fVar50 + fVar276 + fVar35 * fVar57 + fVar43 * fVar64;
              pfVar2[7] = fVar262 + fVar146 + fVar174 + fVar245;
              pfVar2 = (float *)((long)pfVar240 + lVar239 + 0x60);
              *pfVar2 = fVar167 * fVar183 + fVar161 * fVar175 + fVar215 * fVar257 +
                        fVar119 * fVar85 + fVar114 * fVar65 + fVar268 * fVar132 +
                        fVar29 * fVar44 + fVar270 + fVar37 * fVar51 + fVar58 * fVar78;
              pfVar2[1] = fVar168 * fVar184 + fVar162 * fVar176 + fVar216 * fVar248 +
                          fVar120 * fVar86 + fVar115 * fVar66 + fVar126 * fVar133 +
                          fVar30 * fVar45 + fVar271 + fVar38 * fVar52 + fVar59 * fVar79;
              pfVar2[2] = fVar169 * fVar185 + fVar163 * fVar177 + fVar217 * fVar255 +
                          fVar121 * fVar87 + fVar116 * fVar67 + fVar127 * fVar134 +
                          fVar31 * fVar46 + fVar272 + fVar39 * fVar53 + fVar60 * fVar80;
              pfVar2[3] = fVar170 * fVar186 + fVar164 * fVar178 + fVar218 * fVar259 +
                          fVar122 * fVar88 + fVar258 * fVar68 + fVar128 * fVar135 +
                          fVar32 * fVar47 + fVar273 + fVar40 * fVar54 + fVar61 * fVar81;
              pfVar2[4] = fVar171 * fVar187 + fVar165 * fVar179 + fVar219 * fVar191 +
                          fVar123 * fVar89 + fVar260 * fVar69 + fVar129 * fVar136 +
                          fVar33 * fVar48 + fVar274 + fVar41 * fVar55 + fVar62 * fVar82;
              pfVar2[5] = fVar172 * fVar188 + fVar254 * fVar180 + fVar220 * fVar192 +
                          fVar124 * fVar90 + fVar117 * fVar70 + fVar130 * fVar137 +
                          fVar34 * fVar49 + fVar275 + fVar42 * fVar56 + fVar63 * fVar83;
              pfVar2[6] = fVar173 * fVar189 + fVar166 * fVar181 + fVar221 * fVar193 +
                          fVar125 * fVar91 + fVar118 * fVar71 + fVar131 * fVar138 +
                          fVar35 * fVar50 + fVar276 + fVar43 * fVar57 + fVar64 * fVar84;
              pfVar2[7] = in_register_0000141c;
              pfVar2 = (float *)((long)pfVar242 + lVar239);
              *pfVar2 = fVar175 * fVar194 + fVar36 * fVar183 + fVar250 * fVar215 +
                        fVar147 * fVar85 + fVar140 * fVar65 + fVar154 * fVar132 +
                        fVar92 * fVar44 + fVar270 + fVar99 * fVar51 + fVar107 * fVar58;
              pfVar2[1] = fVar176 * fVar195 + fVar243 * fVar184 + fVar253 * fVar216 +
                          fVar148 * fVar86 + fVar141 * fVar66 + fVar155 * fVar133 +
                          fVar93 * fVar45 + fVar271 + fVar100 * fVar52 + fVar108 * fVar59;
              pfVar2[2] = fVar177 * fVar196 + fVar244 * fVar185 + fVar261 * fVar217 +
                          fVar149 * fVar87 + fVar142 * fVar67 + fVar156 * fVar134 +
                          fVar94 * fVar46 + fVar272 + fVar101 * fVar53 + fVar109 * fVar60;
              pfVar2[3] = fVar178 * fVar197 + fVar246 * fVar186 + fVar263 * fVar218 +
                          fVar150 * fVar88 + fVar256 * fVar68 + fVar157 * fVar135 +
                          fVar95 * fVar47 + fVar273 + fVar102 * fVar54 + fVar110 * fVar61;
              pfVar2[4] = fVar179 * fVar198 + fVar247 * fVar187 + fVar266 * fVar219 +
                          fVar151 * fVar89 + fVar143 * fVar69 + fVar158 * fVar136 +
                          fVar96 * fVar48 + fVar274 + fVar103 * fVar55 + fVar111 * fVar62;
              pfVar2[5] = fVar180 * fVar199 + fVar249 * fVar188 + fVar267 * fVar220 +
                          fVar152 * fVar90 + fVar144 * fVar70 + fVar159 * fVar137 +
                          fVar97 * fVar49 + fVar275 + fVar104 * fVar56 + fVar112 * fVar63;
              pfVar2[6] = fVar181 * fVar200 + fVar251 * fVar189 + fVar269 * fVar221 +
                          fVar153 * fVar91 + fVar145 * fVar71 + fVar160 * fVar138 +
                          fVar98 * fVar50 + fVar276 + fVar105 * fVar57 + fVar113 * fVar64;
              pfVar2[7] = fVar139 + fVar252 + fVar190 + fVar264;
              pfVar2 = (float *)((long)pfVar242 + lVar239 + 0x20);
              *pfVar2 = fVar161 * fVar132 + fVar154 * fVar85 + fVar147 * fVar65 +
                        fVar107 * fVar51 + fVar114 * fVar58 + fVar99 * fVar44 + fVar270 +
                        fVar36 * fVar175 + fVar250 * fVar183 + fVar208 * fVar215;
              pfVar2[1] = fVar162 * fVar133 + fVar155 * fVar86 + fVar148 * fVar66 +
                          fVar108 * fVar52 + fVar115 * fVar59 + fVar100 * fVar45 + fVar271 +
                          fVar243 * fVar176 + fVar253 * fVar184 + fVar209 * fVar216;
              pfVar2[2] = fVar163 * fVar134 + fVar156 * fVar87 + fVar149 * fVar67 +
                          fVar109 * fVar53 + fVar116 * fVar60 + fVar101 * fVar46 + fVar272 +
                          fVar244 * fVar177 + fVar261 * fVar185 + fVar210 * fVar217;
              pfVar2[3] = fVar164 * fVar135 + fVar157 * fVar88 + fVar150 * fVar68 +
                          fVar110 * fVar54 + fVar258 * fVar61 + fVar102 * fVar47 + fVar273 +
                          fVar246 * fVar178 + fVar263 * fVar186 + fVar211 * fVar218;
              pfVar2[4] = fVar165 * fVar136 + fVar158 * fVar89 + fVar151 * fVar69 +
                          fVar111 * fVar55 + fVar260 * fVar62 + fVar103 * fVar48 + fVar274 +
                          fVar247 * fVar179 + fVar266 * fVar187 + fVar212 * fVar219;
              pfVar2[5] = fVar254 * fVar137 + fVar159 * fVar90 + fVar152 * fVar70 +
                          fVar112 * fVar56 + fVar117 * fVar63 + fVar104 * fVar49 + fVar275 +
                          fVar249 * fVar180 + fVar267 * fVar188 + fVar213 * fVar220;
              pfVar2[6] = fVar166 * fVar138 + fVar160 * fVar91 + fVar153 * fVar71 +
                          fVar113 * fVar57 + fVar118 * fVar64 + fVar105 * fVar50 + fVar276 +
                          fVar251 * fVar181 + fVar269 * fVar189 + fVar214 * fVar221;
              pfVar2[7] = fVar278 + fVar265 + fVar106 + fVar277 +
                          in_register_0000155c + fVar139 + fVar252;
              pfVar2 = (float *)((long)pfVar242 + lVar239 + 0x40);
              *pfVar2 = fVar154 * fVar65 + fVar161 * fVar85 + fVar132 * fVar167 +
                        fVar107 * fVar44 + fVar270 + fVar114 * fVar51 + fVar119 * fVar58 +
                        fVar222 * fVar215 + fVar250 * fVar175 + fVar208 * fVar183;
              pfVar2[1] = fVar155 * fVar66 + fVar162 * fVar86 + fVar133 * fVar168 +
                          fVar108 * fVar45 + fVar271 + fVar115 * fVar52 + fVar120 * fVar59 +
                          fVar223 * fVar216 + fVar253 * fVar176 + fVar209 * fVar184;
              pfVar2[2] = fVar156 * fVar67 + fVar163 * fVar87 + fVar134 * fVar169 +
                          fVar109 * fVar46 + fVar272 + fVar116 * fVar53 + fVar121 * fVar60 +
                          fVar224 * fVar217 + fVar261 * fVar177 + fVar210 * fVar185;
              pfVar2[3] = fVar157 * fVar68 + fVar164 * fVar88 + fVar135 * fVar170 +
                          fVar110 * fVar47 + fVar273 + fVar258 * fVar54 + fVar122 * fVar61 +
                          fVar225 * fVar218 + fVar263 * fVar178 + fVar211 * fVar186;
              pfVar2[4] = fVar158 * fVar69 + fVar165 * fVar89 + fVar136 * fVar171 +
                          fVar111 * fVar48 + fVar274 + fVar260 * fVar55 + fVar123 * fVar62 +
                          fVar226 * fVar219 + fVar266 * fVar179 + fVar212 * fVar187;
              pfVar2[5] = fVar159 * fVar70 + fVar254 * fVar90 + fVar137 * fVar172 +
                          fVar112 * fVar49 + fVar275 + fVar117 * fVar56 + fVar124 * fVar63 +
                          fVar227 * fVar220 + fVar267 * fVar180 + fVar213 * fVar188;
              pfVar2[6] = fVar160 * fVar71 + fVar166 * fVar91 + fVar138 * fVar173 +
                          fVar113 * fVar50 + fVar276 + fVar118 * fVar57 + fVar125 * fVar64 +
                          fVar228 * fVar221 + fVar269 * fVar181 + fVar214 * fVar189;
              pfVar2[7] = in_register_0000139c;
              pfVar2 = (float *)((long)pfVar242 + lVar239 + 0x60);
              *pfVar2 = fVar114 * fVar44 + fVar270 + fVar119 * fVar51 + fVar268 * fVar58 +
                        fVar132 * fVar257 + fVar161 * fVar65 + fVar167 * fVar85 +
                        fVar208 * fVar175 + fVar222 * fVar183 + fVar215 * fVar201;
              pfVar2[1] = fVar115 * fVar45 + fVar271 + fVar120 * fVar52 + fVar126 * fVar59 +
                          fVar133 * fVar248 + fVar162 * fVar66 + fVar168 * fVar86 +
                          fVar209 * fVar176 + fVar223 * fVar184 + fVar216 * fVar202;
              pfVar2[2] = fVar116 * fVar46 + fVar272 + fVar121 * fVar53 + fVar127 * fVar60 +
                          fVar134 * fVar255 + fVar163 * fVar67 + fVar169 * fVar87 +
                          fVar210 * fVar177 + fVar224 * fVar185 + fVar217 * fVar203;
              pfVar2[3] = fVar258 * fVar47 + fVar273 + fVar122 * fVar54 + fVar128 * fVar61 +
                          fVar135 * fVar259 + fVar164 * fVar68 + fVar170 * fVar88 +
                          fVar211 * fVar178 + fVar225 * fVar186 + fVar218 * fVar204;
              pfVar2[4] = fVar260 * fVar48 + fVar274 + fVar123 * fVar55 + fVar129 * fVar62 +
                          fVar136 * fVar191 + fVar165 * fVar69 + fVar171 * fVar89 +
                          fVar212 * fVar179 + fVar226 * fVar187 + fVar219 * fVar205;
              pfVar2[5] = fVar117 * fVar49 + fVar275 + fVar124 * fVar56 + fVar130 * fVar63 +
                          fVar137 * fVar192 + fVar254 * fVar70 + fVar172 * fVar90 +
                          fVar213 * fVar180 + fVar227 * fVar188 + fVar220 * fVar206;
              pfVar2[6] = fVar118 * fVar50 + fVar276 + fVar125 * fVar57 + fVar131 * fVar64 +
                          fVar138 * fVar193 + fVar166 * fVar71 + fVar173 * fVar91 +
                          fVar214 * fVar181 + fVar228 * fVar189 + fVar221 * fVar207;
              pfVar2[7] = in_register_000012dc + fVar182 + fVar190 + in_register_000013dc;
              lVar239 = lVar239 + 0x80;
              iVar232 = iVar232 + 4;
            } while (iVar232 < (int)uVar12);
            pfVar240 = (float *)((long)pfVar240 + lVar239);
            pfVar242 = (float *)((long)pfVar242 + lVar239);
            pfVar233 = (float *)((long)pfVar233 + lVar239);
            pfVar229 = (float *)((long)pfVar229 + lVar239);
            pfVar230 = (float *)((long)pfVar230 + lVar239);
            lVar235 = lVar235 + lVar239;
            uVar236 = uVar12 & 0xfffffffc;
          }
          if ((int)(uVar236 | 1) < (int)uVar12) {
            lVar239 = 0;
            uVar238 = uVar236;
            do {
              pfVar2 = (float *)((long)pfVar233 + lVar239 + 0x20);
              fVar15 = *pfVar2;
              fVar16 = pfVar2[1];
              fVar17 = pfVar2[2];
              fVar18 = pfVar2[3];
              fVar19 = pfVar2[4];
              fVar20 = pfVar2[5];
              fVar21 = pfVar2[6];
              fVar22 = pfVar2[7];
              pfVar2 = (float *)((long)pfVar233 + lVar239 + 0x40);
              fVar23 = *pfVar2;
              fVar24 = pfVar2[1];
              fVar25 = pfVar2[2];
              fVar26 = pfVar2[3];
              fVar27 = pfVar2[4];
              fVar28 = pfVar2[5];
              fVar29 = pfVar2[6];
              fVar30 = pfVar2[7];
              fVar31 = *pfVar241;
              fVar32 = pfVar241[1];
              fVar33 = pfVar241[2];
              fVar34 = pfVar241[3];
              fVar35 = pfVar241[4];
              fVar36 = pfVar241[5];
              fVar37 = pfVar241[6];
              fVar38 = pfVar241[8];
              fVar39 = pfVar241[9];
              fVar40 = pfVar241[10];
              fVar41 = pfVar241[0xb];
              fVar42 = pfVar241[0xc];
              fVar43 = pfVar241[0xd];
              fVar44 = pfVar241[0xe];
              fVar45 = pfVar241[0x10];
              fVar46 = pfVar241[0x11];
              fVar47 = pfVar241[0x12];
              fVar48 = pfVar241[0x13];
              fVar49 = pfVar241[0x14];
              fVar50 = pfVar241[0x15];
              fVar51 = pfVar241[0x16];
              fVar52 = pfVar241[0x18];
              fVar53 = pfVar241[0x19];
              fVar54 = pfVar241[0x1a];
              fVar55 = pfVar241[0x1b];
              fVar56 = pfVar241[0x1c];
              fVar57 = pfVar241[0x1d];
              fVar58 = pfVar241[0x1e];
              fVar59 = pfVar241[0x1f];
              pfVar5 = (float *)((long)pfVar233 + lVar239);
              fVar60 = pfVar5[1];
              fVar61 = pfVar5[2];
              fVar62 = pfVar5[3];
              fVar63 = pfVar5[4];
              fVar64 = pfVar5[5];
              fVar65 = pfVar5[6];
              fVar257 = fVar277 + in_register_000012dc;
              pfVar2 = (float *)((long)pfVar233 + lVar239 + 0x60);
              fVar66 = *pfVar2;
              fVar67 = pfVar2[1];
              fVar68 = pfVar2[2];
              fVar69 = pfVar2[3];
              fVar70 = pfVar2[4];
              fVar71 = pfVar2[5];
              fVar72 = pfVar2[6];
              fVar258 = fVar277 + in_register_000013dc + in_register_0000141c + fVar30;
              fVar73 = pfVar241[0x20];
              fVar74 = pfVar241[0x21];
              fVar75 = pfVar241[0x22];
              fVar76 = pfVar241[0x23];
              fVar77 = pfVar241[0x24];
              fVar78 = pfVar241[0x25];
              fVar79 = pfVar241[0x26];
              fVar80 = pfVar241[0x27];
              fVar81 = pfVar241[0x28];
              fVar82 = pfVar241[0x29];
              fVar83 = pfVar241[0x2a];
              fVar84 = pfVar241[0x2b];
              fVar85 = pfVar241[0x2c];
              fVar86 = pfVar241[0x2d];
              fVar87 = pfVar241[0x2e];
              fVar88 = pfVar241[0x2f];
              pfVar2 = (float *)((long)pfVar229 + lVar239);
              fVar89 = *pfVar2;
              fVar90 = pfVar2[1];
              fVar91 = pfVar2[2];
              fVar92 = pfVar2[3];
              fVar93 = pfVar2[4];
              fVar94 = pfVar2[5];
              fVar95 = pfVar2[6];
              pfVar3 = (float *)((long)pfVar229 + lVar239 + 0x20);
              fVar96 = *pfVar3;
              fVar97 = pfVar3[1];
              fVar98 = pfVar3[2];
              fVar99 = pfVar3[3];
              fVar100 = pfVar3[4];
              fVar101 = pfVar3[5];
              fVar102 = pfVar3[6];
              pfVar4 = (float *)((long)pfVar229 + lVar239 + 0x40);
              fVar103 = *pfVar4;
              fVar104 = pfVar4[1];
              fVar105 = pfVar4[2];
              fVar106 = pfVar4[3];
              fVar107 = pfVar4[4];
              fVar108 = pfVar4[5];
              fVar109 = pfVar4[6];
              pfVar4 = (float *)((long)pfVar229 + lVar239 + 0x60);
              fVar110 = *pfVar4;
              fVar111 = pfVar4[1];
              fVar112 = pfVar4[2];
              fVar113 = pfVar4[3];
              fVar114 = pfVar4[4];
              fVar115 = pfVar4[5];
              fVar116 = pfVar4[6];
              fVar255 = in_register_0000151c + in_register_0000159c + pfVar241[0xf];
              fVar256 = fVar258 + in_register_0000155c + in_register_0000159c + fVar255;
              fVar259 = pfVar2[7] + fVar277 + pfVar3[7] + fVar258;
              in_register_0000141c = fVar277 + pfVar241[7] + in_register_0000159c + pfVar241[0x17];
              fVar258 = pfVar241[0x30];
              fVar260 = pfVar241[0x31];
              fVar117 = pfVar241[0x32];
              fVar118 = pfVar241[0x33];
              fVar119 = pfVar241[0x34];
              fVar120 = pfVar241[0x35];
              fVar121 = pfVar241[0x36];
              in_register_0000135c = pfVar241[0x37];
              fVar122 = pfVar241[0x38];
              fVar123 = pfVar241[0x39];
              fVar124 = pfVar241[0x3a];
              fVar125 = pfVar241[0x3b];
              fVar268 = pfVar241[0x3c];
              fVar126 = pfVar241[0x3d];
              fVar127 = pfVar241[0x3e];
              fVar128 = pfVar241[0x3f];
              pfVar2 = (float *)((long)pfVar230 + lVar239);
              fVar129 = *pfVar2;
              fVar130 = pfVar2[1];
              fVar131 = pfVar2[2];
              fVar132 = pfVar2[3];
              fVar133 = pfVar2[4];
              fVar134 = pfVar2[5];
              fVar135 = pfVar2[6];
              pfVar3 = (float *)((long)pfVar230 + lVar239 + 0x20);
              fVar136 = *pfVar3;
              fVar137 = pfVar3[1];
              fVar138 = pfVar3[2];
              fVar139 = pfVar3[3];
              fVar140 = pfVar3[4];
              fVar141 = pfVar3[5];
              fVar142 = pfVar3[6];
              pfVar4 = (float *)((long)pfVar230 + lVar239 + 0x40);
              fVar177 = *pfVar4;
              fVar178 = pfVar4[1];
              fVar179 = pfVar4[2];
              fVar180 = pfVar4[3];
              fVar181 = pfVar4[4];
              fVar182 = pfVar4[5];
              fVar183 = pfVar4[6];
              in_register_000014dc = pfVar4[7];
              in_register_0000155c =
                   in_register_0000155c + in_register_0000159c + in_register_0000159c;
              in_register_0000145c = pfVar2[7] + pfVar3[7];
              fVar170 = pfVar241[0x40];
              fVar171 = pfVar241[0x41];
              fVar172 = pfVar241[0x42];
              fVar173 = pfVar241[0x43];
              fVar174 = pfVar241[0x44];
              fVar175 = pfVar241[0x45];
              fVar176 = pfVar241[0x46];
              in_register_0000149c = pfVar241[0x47];
              fVar248 = in_register_0000151c + in_register_0000159c + in_register_0000159c + fVar80;
              pfVar2 = (float *)((long)pfVar230 + lVar239 + 0x60);
              fVar184 = *pfVar2;
              fVar185 = pfVar2[1];
              fVar186 = pfVar2[2];
              fVar187 = pfVar2[3];
              fVar188 = pfVar2[4];
              fVar189 = pfVar2[5];
              fVar190 = pfVar2[6];
              in_register_0000151c = pfVar2[7];
              in_register_000012dc = fVar256 + in_register_0000155c + fVar248;
              in_register_0000139c = fVar259 + in_register_0000145c + fVar256;
              pfVar2 = (float *)(lVar235 + 0x20 + lVar239);
              fVar256 = *pfVar2;
              fVar143 = pfVar2[1];
              fVar144 = pfVar2[2];
              fVar145 = pfVar2[3];
              fVar146 = pfVar2[4];
              fVar147 = pfVar2[5];
              fVar148 = pfVar2[6];
              fVar149 = pfVar2[7];
              pfVar2 = (float *)(lVar235 + lVar239);
              fVar150 = *pfVar2;
              fVar151 = pfVar2[1];
              fVar152 = pfVar2[2];
              fVar153 = pfVar2[3];
              fVar154 = pfVar2[4];
              fVar155 = pfVar2[5];
              fVar156 = pfVar2[6];
              pfVar2 = (float *)(lVar235 + 0x40 + lVar239);
              fVar164 = *pfVar2;
              fVar165 = pfVar2[1];
              fVar254 = pfVar2[2];
              fVar166 = pfVar2[3];
              fVar167 = pfVar2[4];
              fVar168 = pfVar2[5];
              fVar169 = pfVar2[6];
              in_register_000013dc = pfVar2[7];
              pfVar2 = (float *)(lVar235 + 0x60 + lVar239);
              fVar157 = *pfVar2;
              fVar158 = pfVar2[1];
              fVar159 = pfVar2[2];
              fVar160 = pfVar2[3];
              fVar161 = pfVar2[4];
              fVar162 = pfVar2[5];
              fVar163 = pfVar2[6];
              pfVar2 = (float *)((long)pfVar240 + lVar239);
              *pfVar2 = fVar270 + fVar31 * *pfVar5 + fVar15 * fVar38 + fVar23 * fVar45 +
                        fVar89 * fVar52 + fVar96 * fVar73 + fVar103 * fVar81 +
                        fVar129 * fVar258 + fVar136 * fVar122 + fVar177 * fVar170;
              pfVar2[1] = fVar271 + fVar32 * fVar60 + fVar16 * fVar39 + fVar24 * fVar46 +
                          fVar90 * fVar53 + fVar97 * fVar74 + fVar104 * fVar82 +
                          fVar130 * fVar260 + fVar137 * fVar123 + fVar178 * fVar171;
              pfVar2[2] = fVar272 + fVar33 * fVar61 + fVar17 * fVar40 + fVar25 * fVar47 +
                          fVar91 * fVar54 + fVar98 * fVar75 + fVar105 * fVar83 +
                          fVar131 * fVar117 + fVar138 * fVar124 + fVar179 * fVar172;
              pfVar2[3] = fVar273 + fVar34 * fVar62 + fVar18 * fVar41 + fVar26 * fVar48 +
                          fVar92 * fVar55 + fVar99 * fVar76 + fVar106 * fVar84 +
                          fVar132 * fVar118 + fVar139 * fVar125 + fVar180 * fVar173;
              pfVar2[4] = fVar274 + fVar35 * fVar63 + fVar19 * fVar42 + fVar27 * fVar49 +
                          fVar93 * fVar56 + fVar100 * fVar77 + fVar107 * fVar85 +
                          fVar133 * fVar119 + fVar140 * fVar268 + fVar181 * fVar174;
              pfVar2[5] = fVar275 + fVar36 * fVar64 + fVar20 * fVar43 + fVar28 * fVar50 +
                          fVar94 * fVar57 + fVar101 * fVar78 + fVar108 * fVar86 +
                          fVar134 * fVar120 + fVar141 * fVar126 + fVar182 * fVar175;
              pfVar2[6] = fVar276 + fVar37 * fVar65 + fVar21 * fVar44 + fVar29 * fVar51 +
                          fVar95 * fVar58 + fVar102 * fVar79 + fVar109 * fVar87 +
                          fVar135 * fVar121 + fVar142 * fVar127 + fVar183 * fVar176;
              pfVar2[7] = fVar257 + fVar22 + fVar30 + fVar255 + fVar248;
              pfVar2 = (float *)((long)pfVar240 + lVar239 + 0x20);
              *pfVar2 = fVar270 + fVar15 * fVar31 + fVar23 * fVar38 + fVar45 * fVar66 +
                        fVar96 * fVar52 + fVar103 * fVar73 + fVar110 * fVar81 +
                        fVar136 * fVar258 + fVar177 * fVar122 + fVar184 * fVar170;
              pfVar2[1] = fVar271 + fVar16 * fVar32 + fVar24 * fVar39 + fVar46 * fVar67 +
                          fVar97 * fVar53 + fVar104 * fVar74 + fVar111 * fVar82 +
                          fVar137 * fVar260 + fVar178 * fVar123 + fVar185 * fVar171;
              pfVar2[2] = fVar272 + fVar17 * fVar33 + fVar25 * fVar40 + fVar47 * fVar68 +
                          fVar98 * fVar54 + fVar105 * fVar75 + fVar112 * fVar83 +
                          fVar138 * fVar117 + fVar179 * fVar124 + fVar186 * fVar172;
              pfVar2[3] = fVar273 + fVar18 * fVar34 + fVar26 * fVar41 + fVar48 * fVar69 +
                          fVar99 * fVar55 + fVar106 * fVar76 + fVar113 * fVar84 +
                          fVar139 * fVar118 + fVar180 * fVar125 + fVar187 * fVar173;
              pfVar2[4] = fVar274 + fVar19 * fVar35 + fVar27 * fVar42 + fVar49 * fVar70 +
                          fVar100 * fVar56 + fVar107 * fVar77 + fVar114 * fVar85 +
                          fVar140 * fVar119 + fVar181 * fVar268 + fVar188 * fVar174;
              pfVar2[5] = fVar275 + fVar20 * fVar36 + fVar28 * fVar43 + fVar50 * fVar71 +
                          fVar101 * fVar57 + fVar108 * fVar78 + fVar115 * fVar86 +
                          fVar141 * fVar120 + fVar182 * fVar126 + fVar189 * fVar175;
              pfVar2[6] = fVar276 + fVar21 * fVar37 + fVar29 * fVar44 + fVar51 * fVar72 +
                          fVar102 * fVar58 + fVar109 * fVar79 + fVar116 * fVar87 +
                          fVar142 * fVar121 + fVar183 * fVar127 + fVar190 * fVar176;
              pfVar2[7] = in_register_000012dc;
              pfVar2 = (float *)((long)pfVar242 + lVar239);
              *pfVar2 = fVar89 * fVar31 + fVar270 + fVar96 * fVar38 + fVar103 * fVar45 +
                        fVar129 * fVar52 + fVar136 * fVar73 + fVar177 * fVar81 +
                        fVar258 * fVar150 + fVar256 * fVar122 + fVar170 * fVar164;
              pfVar2[1] = fVar90 * fVar32 + fVar271 + fVar97 * fVar39 + fVar104 * fVar46 +
                          fVar130 * fVar53 + fVar137 * fVar74 + fVar178 * fVar82 +
                          fVar260 * fVar151 + fVar143 * fVar123 + fVar171 * fVar165;
              pfVar2[2] = fVar91 * fVar33 + fVar272 + fVar98 * fVar40 + fVar105 * fVar47 +
                          fVar131 * fVar54 + fVar138 * fVar75 + fVar179 * fVar83 +
                          fVar117 * fVar152 + fVar144 * fVar124 + fVar172 * fVar254;
              pfVar2[3] = fVar92 * fVar34 + fVar273 + fVar99 * fVar41 + fVar106 * fVar48 +
                          fVar132 * fVar55 + fVar139 * fVar76 + fVar180 * fVar84 +
                          fVar118 * fVar153 + fVar145 * fVar125 + fVar173 * fVar166;
              pfVar2[4] = fVar93 * fVar35 + fVar274 + fVar100 * fVar42 + fVar107 * fVar49 +
                          fVar133 * fVar56 + fVar140 * fVar77 + fVar181 * fVar85 +
                          fVar119 * fVar154 + fVar146 * fVar268 + fVar174 * fVar167;
              pfVar2[5] = fVar94 * fVar36 + fVar275 + fVar101 * fVar43 + fVar108 * fVar50 +
                          fVar134 * fVar57 + fVar141 * fVar78 + fVar182 * fVar86 +
                          fVar120 * fVar155 + fVar147 * fVar126 + fVar175 * fVar168;
              pfVar2[6] = fVar95 * fVar37 + fVar276 + fVar102 * fVar44 + fVar109 * fVar51 +
                          fVar135 * fVar58 + fVar142 * fVar79 + fVar183 * fVar87 +
                          fVar121 * fVar156 + fVar148 * fVar127 + fVar176 * fVar169;
              pfVar2[7] = in_register_0000139c + fVar259 + fVar149 + in_register_0000135c;
              pfVar2 = (float *)((long)pfVar242 + lVar239 + 0x20);
              *pfVar2 = fVar270 + fVar96 * fVar31 + fVar103 * fVar38 + fVar110 * fVar45 +
                        fVar136 * fVar52 + fVar177 * fVar73 + fVar184 * fVar81 +
                        fVar256 * fVar258 + fVar164 * fVar122 + fVar170 * fVar157;
              pfVar2[1] = fVar271 + fVar97 * fVar32 + fVar104 * fVar39 + fVar111 * fVar46 +
                          fVar137 * fVar53 + fVar178 * fVar74 + fVar185 * fVar82 +
                          fVar143 * fVar260 + fVar165 * fVar123 + fVar171 * fVar158;
              pfVar2[2] = fVar272 + fVar98 * fVar33 + fVar105 * fVar40 + fVar112 * fVar47 +
                          fVar138 * fVar54 + fVar179 * fVar75 + fVar186 * fVar83 +
                          fVar144 * fVar117 + fVar254 * fVar124 + fVar172 * fVar159;
              pfVar2[3] = fVar273 + fVar99 * fVar34 + fVar106 * fVar41 + fVar113 * fVar48 +
                          fVar139 * fVar55 + fVar180 * fVar76 + fVar187 * fVar84 +
                          fVar145 * fVar118 + fVar166 * fVar125 + fVar173 * fVar160;
              pfVar2[4] = fVar274 + fVar100 * fVar35 + fVar107 * fVar42 + fVar114 * fVar49 +
                          fVar140 * fVar56 + fVar181 * fVar77 + fVar188 * fVar85 +
                          fVar146 * fVar119 + fVar167 * fVar268 + fVar174 * fVar161;
              pfVar2[5] = fVar275 + fVar101 * fVar36 + fVar108 * fVar43 + fVar115 * fVar50 +
                          fVar141 * fVar57 + fVar182 * fVar78 + fVar189 * fVar86 +
                          fVar147 * fVar120 + fVar168 * fVar126 + fVar175 * fVar162;
              pfVar2[6] = fVar276 + fVar102 * fVar37 + fVar109 * fVar44 + fVar116 * fVar51 +
                          fVar142 * fVar58 + fVar183 * fVar79 + fVar190 * fVar87 +
                          fVar148 * fVar121 + fVar169 * fVar127 + fVar176 * fVar163;
              pfVar2[7] = in_register_0000141c + fVar59 + fVar80 + fVar88 +
                          in_register_0000135c + fVar128 + in_register_0000135c;
              uVar236 = uVar238 + 2;
              lVar239 = lVar239 + 0x40;
              iVar232 = uVar238 + 3;
              uVar238 = uVar236;
            } while (iVar232 < (int)uVar12);
            pfVar240 = (float *)((long)pfVar240 + lVar239);
            pfVar242 = (float *)((long)pfVar242 + lVar239);
            pfVar233 = (float *)((long)pfVar233 + lVar239);
            pfVar229 = (float *)((long)pfVar229 + lVar239);
            pfVar230 = (float *)((long)pfVar230 + lVar239);
            lVar235 = lVar235 + lVar239;
          }
          if ((int)uVar236 < (int)uVar12) {
            iVar232 = uVar12 - uVar236;
            lVar239 = 0;
            do {
              fVar15 = *pfVar241;
              fVar16 = pfVar241[1];
              fVar17 = pfVar241[2];
              fVar18 = pfVar241[3];
              fVar19 = pfVar241[4];
              fVar20 = pfVar241[5];
              fVar21 = pfVar241[6];
              fVar22 = pfVar241[7];
              fVar23 = pfVar241[8];
              fVar24 = pfVar241[9];
              fVar25 = pfVar241[10];
              fVar26 = pfVar241[0xb];
              fVar27 = pfVar241[0xc];
              fVar28 = pfVar241[0xd];
              fVar29 = pfVar241[0xe];
              fVar30 = pfVar241[0xf];
              fVar31 = pfVar241[0x10];
              fVar32 = pfVar241[0x11];
              fVar33 = pfVar241[0x12];
              fVar34 = pfVar241[0x13];
              fVar35 = pfVar241[0x14];
              fVar36 = pfVar241[0x15];
              fVar37 = pfVar241[0x16];
              fVar38 = pfVar241[0x17];
              pfVar10 = (float *)((long)pfVar233 + lVar239);
              fVar39 = pfVar10[1];
              fVar40 = pfVar10[2];
              fVar41 = pfVar10[3];
              fVar42 = pfVar10[4];
              fVar43 = pfVar10[5];
              fVar44 = pfVar10[6];
              fVar45 = pfVar241[0x18];
              fVar46 = pfVar241[0x19];
              fVar47 = pfVar241[0x1a];
              fVar48 = pfVar241[0x1b];
              fVar49 = pfVar241[0x1c];
              fVar50 = pfVar241[0x1d];
              fVar51 = pfVar241[0x1e];
              fVar52 = pfVar241[0x1f];
              pfVar3 = (float *)((long)pfVar233 + lVar239 + 0x20);
              fVar53 = pfVar3[1];
              fVar54 = pfVar3[2];
              fVar55 = pfVar3[3];
              fVar56 = pfVar3[4];
              fVar57 = pfVar3[5];
              fVar58 = pfVar3[6];
              pfVar4 = (float *)((long)pfVar233 + lVar239 + 0x40);
              fVar59 = pfVar4[1];
              fVar60 = pfVar4[2];
              fVar61 = pfVar4[3];
              fVar62 = pfVar4[4];
              fVar63 = pfVar4[5];
              fVar64 = pfVar4[6];
              fVar258 = in_register_0000135c + in_register_0000139c;
              fVar65 = pfVar241[0x20];
              fVar66 = pfVar241[0x21];
              fVar67 = pfVar241[0x22];
              fVar68 = pfVar241[0x23];
              fVar69 = pfVar241[0x24];
              fVar70 = pfVar241[0x25];
              fVar71 = pfVar241[0x26];
              fVar72 = pfVar241[0x27];
              fVar135 = pfVar241[0x28];
              fVar136 = pfVar241[0x29];
              fVar137 = pfVar241[0x2a];
              fVar138 = pfVar241[0x2b];
              fVar139 = pfVar241[0x2c];
              fVar140 = pfVar241[0x2d];
              fVar141 = pfVar241[0x2e];
              in_register_0000139c = pfVar241[0x2f];
              pfVar2 = (float *)((long)pfVar229 + lVar239);
              fVar73 = *pfVar2;
              fVar74 = pfVar2[1];
              fVar75 = pfVar2[2];
              fVar76 = pfVar2[3];
              fVar77 = pfVar2[4];
              fVar78 = pfVar2[5];
              fVar79 = pfVar2[6];
              pfVar5 = (float *)((long)pfVar229 + lVar239 + 0x20);
              fVar80 = *pfVar5;
              fVar81 = pfVar5[1];
              fVar82 = pfVar5[2];
              fVar83 = pfVar5[3];
              fVar84 = pfVar5[4];
              fVar85 = pfVar5[5];
              fVar86 = pfVar5[6];
              pfVar8 = (float *)((long)pfVar229 + lVar239 + 0x40);
              fVar87 = *pfVar8;
              fVar88 = pfVar8[1];
              fVar89 = pfVar8[2];
              fVar90 = pfVar8[3];
              fVar91 = pfVar8[4];
              fVar92 = pfVar8[5];
              fVar93 = pfVar8[6];
              fVar260 = in_register_0000149c + pfVar2[7];
              fVar94 = pfVar241[0x30];
              fVar95 = pfVar241[0x31];
              fVar96 = pfVar241[0x32];
              fVar97 = pfVar241[0x33];
              fVar98 = pfVar241[0x34];
              fVar99 = pfVar241[0x35];
              fVar100 = pfVar241[0x36];
              fVar101 = pfVar241[0x37];
              fVar102 = pfVar241[0x38];
              fVar103 = pfVar241[0x39];
              fVar104 = pfVar241[0x3a];
              fVar105 = pfVar241[0x3b];
              fVar106 = pfVar241[0x3c];
              fVar107 = pfVar241[0x3d];
              fVar108 = pfVar241[0x3e];
              fVar109 = pfVar241[0x3f];
              fVar142 = pfVar241[0x40];
              fVar256 = pfVar241[0x41];
              fVar143 = pfVar241[0x42];
              fVar144 = pfVar241[0x43];
              fVar145 = pfVar241[0x44];
              fVar146 = pfVar241[0x45];
              fVar147 = pfVar241[0x46];
              in_register_000013dc = pfVar241[0x47];
              pfVar2 = (float *)((long)pfVar230 + lVar239);
              fVar110 = *pfVar2;
              fVar111 = pfVar2[1];
              fVar112 = pfVar2[2];
              fVar113 = pfVar2[3];
              fVar114 = pfVar2[4];
              fVar115 = pfVar2[5];
              fVar116 = pfVar2[6];
              pfVar8 = (float *)((long)pfVar230 + lVar239 + 0x20);
              fVar148 = *pfVar8;
              fVar149 = pfVar8[1];
              fVar150 = pfVar8[2];
              fVar151 = pfVar8[3];
              fVar152 = pfVar8[4];
              fVar153 = pfVar8[5];
              fVar154 = pfVar8[6];
              in_register_0000145c = pfVar8[7];
              pfVar8 = (float *)((long)pfVar230 + lVar239 + 0x40);
              fVar155 = *pfVar8;
              fVar156 = pfVar8[1];
              fVar157 = pfVar8[2];
              fVar158 = pfVar8[3];
              fVar159 = pfVar8[4];
              fVar160 = pfVar8[5];
              fVar161 = pfVar8[6];
              in_register_0000149c = pfVar8[7];
              in_register_0000141c = in_register_000014dc + pfVar2[7];
              in_register_0000135c = in_register_0000141c + fVar72;
              in_register_000012dc =
                   fVar277 + in_register_000012dc + fVar258 + pfVar5[7] + fVar260 +
                   in_register_0000135c;
              pfVar2 = (float *)(lVar235 + lVar239);
              fVar258 = *pfVar2;
              fVar260 = pfVar2[1];
              fVar117 = pfVar2[2];
              fVar118 = pfVar2[3];
              fVar119 = pfVar2[4];
              fVar120 = pfVar2[5];
              fVar121 = pfVar2[6];
              pfVar2 = (float *)(lVar235 + 0x20 + lVar239);
              fVar122 = *pfVar2;
              fVar123 = pfVar2[1];
              fVar124 = pfVar2[2];
              fVar125 = pfVar2[3];
              fVar268 = pfVar2[4];
              fVar126 = pfVar2[5];
              fVar127 = pfVar2[6];
              pfVar2 = (float *)(lVar235 + 0x40 + lVar239);
              fVar128 = *pfVar2;
              fVar129 = pfVar2[1];
              fVar130 = pfVar2[2];
              fVar131 = pfVar2[3];
              fVar132 = pfVar2[4];
              fVar133 = pfVar2[5];
              fVar134 = pfVar2[6];
              pfVar2 = (float *)((long)pfVar240 + lVar239);
              *pfVar2 = fVar270 + fVar15 * *pfVar10 + fVar23 * *pfVar3 + fVar31 * *pfVar4 +
                        fVar87 * fVar135 + fVar73 * fVar45 + fVar80 * fVar65 +
                        fVar110 * fVar94 + fVar148 * fVar102 + fVar155 * fVar142;
              pfVar2[1] = fVar271 + fVar16 * fVar39 + fVar24 * fVar53 + fVar32 * fVar59 +
                          fVar88 * fVar136 + fVar74 * fVar46 + fVar81 * fVar66 +
                          fVar111 * fVar95 + fVar149 * fVar103 + fVar156 * fVar256;
              pfVar2[2] = fVar272 + fVar17 * fVar40 + fVar25 * fVar54 + fVar33 * fVar60 +
                          fVar89 * fVar137 + fVar75 * fVar47 + fVar82 * fVar67 +
                          fVar112 * fVar96 + fVar150 * fVar104 + fVar157 * fVar143;
              pfVar2[3] = fVar273 + fVar18 * fVar41 + fVar26 * fVar55 + fVar34 * fVar61 +
                          fVar90 * fVar138 + fVar76 * fVar48 + fVar83 * fVar68 +
                          fVar113 * fVar97 + fVar151 * fVar105 + fVar158 * fVar144;
              pfVar2[4] = fVar274 + fVar19 * fVar42 + fVar27 * fVar56 + fVar35 * fVar62 +
                          fVar91 * fVar139 + fVar77 * fVar49 + fVar84 * fVar69 +
                          fVar114 * fVar98 + fVar152 * fVar106 + fVar159 * fVar145;
              pfVar2[5] = fVar275 + fVar20 * fVar43 + fVar28 * fVar57 + fVar36 * fVar63 +
                          fVar92 * fVar140 + fVar78 * fVar50 + fVar85 * fVar70 +
                          fVar115 * fVar99 + fVar153 * fVar107 + fVar160 * fVar146;
              pfVar2[6] = fVar276 + fVar21 * fVar44 + fVar29 * fVar58 + fVar37 * fVar64 +
                          fVar93 * fVar141 + fVar79 * fVar51 + fVar86 * fVar71 +
                          fVar116 * fVar100 + fVar154 * fVar108 + fVar161 * fVar147;
              pfVar2[7] = in_register_000012dc;
              pfVar2 = (float *)((long)pfVar242 + lVar239);
              *pfVar2 = fVar270 + fVar73 * fVar15 + fVar80 * fVar23 + fVar87 * fVar31 +
                        fVar110 * fVar45 + fVar148 * fVar65 + fVar155 * fVar135 +
                        fVar94 * fVar258 + fVar102 * fVar122 + fVar142 * fVar128;
              pfVar2[1] = fVar271 + fVar74 * fVar16 + fVar81 * fVar24 + fVar88 * fVar32 +
                          fVar111 * fVar46 + fVar149 * fVar66 + fVar156 * fVar136 +
                          fVar95 * fVar260 + fVar103 * fVar123 + fVar256 * fVar129;
              pfVar2[2] = fVar272 + fVar75 * fVar17 + fVar82 * fVar25 + fVar89 * fVar33 +
                          fVar112 * fVar47 + fVar150 * fVar67 + fVar157 * fVar137 +
                          fVar96 * fVar117 + fVar104 * fVar124 + fVar143 * fVar130;
              pfVar2[3] = fVar273 + fVar76 * fVar18 + fVar83 * fVar26 + fVar90 * fVar34 +
                          fVar113 * fVar48 + fVar151 * fVar68 + fVar158 * fVar138 +
                          fVar97 * fVar118 + fVar105 * fVar125 + fVar144 * fVar131;
              pfVar2[4] = fVar274 + fVar77 * fVar19 + fVar84 * fVar27 + fVar91 * fVar35 +
                          fVar114 * fVar49 + fVar152 * fVar69 + fVar159 * fVar139 +
                          fVar98 * fVar119 + fVar106 * fVar268 + fVar145 * fVar132;
              pfVar2[5] = fVar275 + fVar78 * fVar20 + fVar85 * fVar28 + fVar92 * fVar36 +
                          fVar115 * fVar50 + fVar153 * fVar70 + fVar160 * fVar140 +
                          fVar99 * fVar120 + fVar107 * fVar126 + fVar146 * fVar133;
              pfVar2[6] = fVar276 + fVar79 * fVar21 + fVar86 * fVar29 + fVar93 * fVar37 +
                          fVar116 * fVar51 + fVar154 * fVar71 + fVar161 * fVar141 +
                          fVar100 * fVar121 + fVar108 * fVar127 + fVar147 * fVar134;
              pfVar2[7] = fVar277 + fVar22 + fVar30 + fVar38 +
                          fVar52 + fVar72 + in_register_0000135c + fVar101 + fVar109 + fVar109;
              lVar239 = lVar239 + 0x20;
              iVar232 = iVar232 + -1;
            } while (iVar232 != 0);
            pfVar240 = (float *)((long)pfVar240 + lVar239);
            pfVar242 = (float *)((long)pfVar242 + lVar239);
            pfVar233 = (float *)((long)pfVar233 + lVar239);
            pfVar229 = (float *)((long)pfVar229 + lVar239);
            pfVar230 = (float *)((long)pfVar230 + lVar239);
            lVar235 = lVar235 + lVar239;
          }
          pfVar233 = pfVar233 + lVar1;
          pfVar229 = pfVar229 + lVar1;
          pfVar230 = pfVar230 + lVar1;
          lVar235 = lVar235 + lVar1 * 4;
          pfVar240 = pfVar240 + (long)(int)uVar12 * 8;
          pfVar242 = pfVar242 + (long)(int)uVar12 * 8;
          iVar232 = iVar234 + 3;
          iVar234 = iVar234 + 2;
          uVar236 = uVar13 & 0xfffffffe;
        } while (iVar232 < (int)uVar13);
      }
      if ((int)uVar236 < (int)uVar13) {
        do {
          uVar238 = 0;
          if (3 < (int)uVar12) {
            iVar234 = 3;
            do {
              fVar15 = pfVar233[8];
              fVar16 = pfVar233[9];
              fVar17 = pfVar233[10];
              fVar18 = pfVar233[0xb];
              fVar19 = pfVar233[0xc];
              fVar20 = pfVar233[0xd];
              fVar21 = pfVar233[0xe];
              pfVar242 = pfVar233 + 0xf;
              fVar22 = pfVar233[0x10];
              fVar23 = pfVar233[0x11];
              fVar24 = pfVar233[0x12];
              fVar25 = pfVar233[0x13];
              fVar26 = pfVar233[0x14];
              fVar27 = pfVar233[0x15];
              fVar28 = pfVar233[0x16];
              pfVar2 = pfVar233 + 0x17;
              fVar29 = pfVar233[0x18];
              fVar30 = pfVar233[0x19];
              fVar31 = pfVar233[0x1a];
              fVar32 = pfVar233[0x1b];
              fVar33 = pfVar233[0x1c];
              fVar34 = pfVar233[0x1d];
              fVar35 = pfVar233[0x1e];
              pfVar3 = pfVar233 + 0x1f;
              fVar36 = *pfVar241;
              fVar37 = pfVar241[1];
              fVar38 = pfVar241[2];
              fVar39 = pfVar241[3];
              fVar40 = pfVar241[4];
              fVar41 = pfVar241[5];
              fVar42 = pfVar241[6];
              fVar43 = pfVar241[0x10];
              fVar44 = pfVar241[0x11];
              fVar45 = pfVar241[0x12];
              fVar46 = pfVar241[0x13];
              fVar47 = pfVar241[0x14];
              fVar48 = pfVar241[0x15];
              fVar49 = pfVar241[0x16];
              fVar50 = pfVar241[0x17];
              fVar51 = *pfVar233;
              fVar52 = pfVar233[1];
              fVar53 = pfVar233[2];
              fVar54 = pfVar233[3];
              fVar55 = pfVar233[4];
              fVar56 = pfVar233[5];
              fVar57 = pfVar233[6];
              fVar58 = pfVar233[0x28];
              fVar59 = pfVar233[0x29];
              fVar60 = pfVar233[0x2a];
              fVar61 = pfVar233[0x2b];
              fVar62 = pfVar233[0x2c];
              fVar63 = pfVar233[0x2d];
              fVar64 = pfVar233[0x2e];
              fVar65 = pfVar233[0x20];
              fVar66 = pfVar233[0x21];
              fVar67 = pfVar233[0x22];
              fVar68 = pfVar233[0x23];
              fVar69 = pfVar233[0x24];
              fVar70 = pfVar233[0x25];
              fVar71 = pfVar233[0x26];
              pfVar233 = pfVar233 + 0x20;
              fVar72 = pfVar241[8];
              fVar73 = pfVar241[9];
              fVar74 = pfVar241[10];
              fVar75 = pfVar241[0xb];
              fVar76 = pfVar241[0xc];
              fVar77 = pfVar241[0xd];
              fVar78 = pfVar241[0xe];
              fVar79 = pfVar241[0x18];
              fVar80 = pfVar241[0x19];
              fVar81 = pfVar241[0x1a];
              fVar82 = pfVar241[0x1b];
              fVar83 = pfVar241[0x1c];
              fVar84 = pfVar241[0x1d];
              fVar85 = pfVar241[0x1e];
              fVar86 = pfVar241[0x1f];
              fVar263 = in_register_0000149c + fVar277;
              fVar266 = in_register_000014dc + fVar277;
              fVar250 = fVar277 + in_register_0000139c + *pfVar242 + *pfVar2;
              fVar252 = in_register_0000151c + *pfVar3;
              fVar253 = pfVar241[0xf] + in_register_000013dc;
              fVar87 = pfVar241[0x20];
              fVar88 = pfVar241[0x21];
              fVar89 = pfVar241[0x22];
              fVar90 = pfVar241[0x23];
              fVar91 = pfVar241[0x24];
              fVar92 = pfVar241[0x25];
              fVar93 = pfVar241[0x26];
              fVar94 = pfVar241[0x28];
              fVar95 = pfVar241[0x29];
              fVar96 = pfVar241[0x2a];
              fVar97 = pfVar241[0x2b];
              fVar98 = pfVar241[0x2c];
              fVar99 = pfVar241[0x2d];
              fVar100 = pfVar241[0x2e];
              fVar101 = pfVar229[8];
              fVar102 = pfVar229[9];
              fVar103 = pfVar229[10];
              fVar104 = pfVar229[0xb];
              fVar105 = pfVar229[0xc];
              fVar106 = pfVar229[0xd];
              fVar107 = pfVar229[0xe];
              fVar108 = pfVar229[0xf];
              fVar109 = pfVar229[0x10];
              fVar110 = pfVar229[0x11];
              fVar111 = pfVar229[0x12];
              fVar112 = pfVar229[0x13];
              fVar113 = pfVar229[0x14];
              fVar114 = pfVar229[0x15];
              fVar115 = pfVar229[0x16];
              fVar116 = pfVar229[0x18];
              fVar258 = pfVar229[0x19];
              fVar260 = pfVar229[0x1a];
              fVar117 = pfVar229[0x1b];
              fVar118 = pfVar229[0x1c];
              fVar119 = pfVar229[0x1d];
              fVar120 = pfVar229[0x1e];
              fVar121 = pfVar229[0x20];
              fVar122 = pfVar229[0x21];
              fVar123 = pfVar229[0x22];
              fVar124 = pfVar229[0x23];
              fVar125 = pfVar229[0x24];
              fVar268 = pfVar229[0x25];
              fVar126 = pfVar229[0x26];
              fVar127 = pfVar229[0x27];
              fVar128 = *pfVar229;
              fVar129 = pfVar229[1];
              fVar130 = pfVar229[2];
              fVar131 = pfVar229[3];
              fVar132 = pfVar229[4];
              fVar133 = pfVar229[5];
              fVar134 = pfVar229[6];
              fVar267 = in_register_0000151c + fVar266;
              fVar269 = in_register_0000155c + in_register_0000151c;
              fVar135 = pfVar229[0x28];
              fVar136 = pfVar229[0x29];
              fVar137 = pfVar229[0x2a];
              fVar138 = pfVar229[0x2b];
              fVar139 = pfVar229[0x2c];
              fVar140 = pfVar229[0x2d];
              fVar141 = pfVar229[0x2e];
              pfVar229 = pfVar229 + 0x20;
              fVar142 = pfVar241[0x30];
              fVar256 = pfVar241[0x31];
              fVar143 = pfVar241[0x32];
              fVar144 = pfVar241[0x33];
              fVar145 = pfVar241[0x34];
              fVar146 = pfVar241[0x35];
              fVar147 = pfVar241[0x36];
              fVar148 = pfVar241[0x38];
              fVar149 = pfVar241[0x39];
              fVar150 = pfVar241[0x3a];
              fVar151 = pfVar241[0x3b];
              fVar152 = pfVar241[0x3c];
              fVar153 = pfVar241[0x3d];
              fVar154 = pfVar241[0x3e];
              fVar183 = pfVar241[0x40];
              fVar184 = pfVar241[0x41];
              fVar185 = pfVar241[0x42];
              fVar186 = pfVar241[0x43];
              fVar187 = pfVar241[0x44];
              fVar188 = pfVar241[0x45];
              fVar189 = pfVar241[0x46];
              in_register_0000135c = pfVar241[0x47];
              fVar155 = pfVar230[8];
              fVar156 = pfVar230[9];
              fVar157 = pfVar230[10];
              fVar158 = pfVar230[0xb];
              fVar159 = pfVar230[0xc];
              fVar160 = pfVar230[0xd];
              fVar161 = pfVar230[0xe];
              fVar190 = pfVar230[0x10];
              fVar257 = pfVar230[0x11];
              fVar248 = pfVar230[0x12];
              fVar255 = pfVar230[0x13];
              fVar259 = pfVar230[0x14];
              fVar191 = pfVar230[0x15];
              fVar192 = pfVar230[0x16];
              in_register_0000145c = pfVar230[0x17];
              fVar193 = pfVar230[0x18];
              fVar243 = pfVar230[0x19];
              fVar244 = pfVar230[0x1a];
              fVar246 = pfVar230[0x1b];
              fVar247 = pfVar230[0x1c];
              fVar249 = pfVar230[0x1d];
              fVar251 = pfVar230[0x1e];
              in_register_0000149c = pfVar230[0x1f];
              fVar162 = pfVar230[0x20];
              fVar163 = pfVar230[0x21];
              fVar164 = pfVar230[0x22];
              fVar165 = pfVar230[0x23];
              fVar254 = pfVar230[0x24];
              fVar166 = pfVar230[0x25];
              fVar167 = pfVar230[0x26];
              fVar168 = pfVar230[0x27];
              fVar169 = *pfVar230;
              fVar170 = pfVar230[1];
              fVar171 = pfVar230[2];
              fVar172 = pfVar230[3];
              fVar173 = pfVar230[4];
              fVar174 = pfVar230[5];
              fVar175 = pfVar230[6];
              in_register_0000141c = fVar267 + pfVar230[0xf];
              in_register_000014dc = fVar269 + fVar267;
              in_register_0000151c = in_register_0000155c + fVar269;
              fVar176 = pfVar230[0x28];
              fVar177 = pfVar230[0x29];
              fVar178 = pfVar230[0x2a];
              fVar179 = pfVar230[0x2b];
              fVar180 = pfVar230[0x2c];
              fVar181 = pfVar230[0x2d];
              fVar182 = pfVar230[0x2e];
              pfVar230 = pfVar230 + 0x20;
              in_register_0000139c = pfVar241[0x37] + pfVar241[0x3f];
              fVar261 = in_register_0000141c + pfVar241[0x3f];
              in_register_000013dc = in_register_000014dc + fVar261;
              in_register_000012dc =
                   fVar277 + pfVar241[7] + fVar253 + in_register_0000155c + fVar86 + pfVar241[0x27]
                   + in_register_0000155c + in_register_0000139c;
              *pfVar240 = fVar270 + fVar36 * fVar51 + fVar72 * fVar15 + fVar22 * fVar43 +
                          fVar79 * fVar128 + fVar101 * fVar87 + fVar109 * fVar94 +
                          fVar142 * fVar169 + fVar155 * fVar148 + fVar190 * fVar183;
              pfVar240[1] = fVar271 + fVar37 * fVar52 + fVar73 * fVar16 + fVar23 * fVar44 +
                            fVar80 * fVar129 + fVar102 * fVar88 + fVar110 * fVar95 +
                            fVar256 * fVar170 + fVar156 * fVar149 + fVar257 * fVar184;
              pfVar240[2] = fVar272 + fVar38 * fVar53 + fVar74 * fVar17 + fVar24 * fVar45 +
                            fVar81 * fVar130 + fVar103 * fVar89 + fVar111 * fVar96 +
                            fVar143 * fVar171 + fVar157 * fVar150 + fVar248 * fVar185;
              pfVar240[3] = fVar273 + fVar39 * fVar54 + fVar75 * fVar18 + fVar25 * fVar46 +
                            fVar82 * fVar131 + fVar104 * fVar90 + fVar112 * fVar97 +
                            fVar144 * fVar172 + fVar158 * fVar151 + fVar255 * fVar186;
              pfVar240[4] = fVar274 + fVar40 * fVar55 + fVar76 * fVar19 + fVar26 * fVar47 +
                            fVar83 * fVar132 + fVar105 * fVar91 + fVar113 * fVar98 +
                            fVar145 * fVar173 + fVar159 * fVar152 + fVar259 * fVar187;
              pfVar240[5] = fVar275 + fVar41 * fVar56 + fVar77 * fVar20 + fVar27 * fVar48 +
                            fVar84 * fVar133 + fVar106 * fVar92 + fVar114 * fVar99 +
                            fVar146 * fVar174 + fVar160 * fVar153 + fVar191 * fVar188;
              pfVar240[6] = fVar276 + fVar42 * fVar57 + fVar78 * fVar21 + fVar28 * fVar49 +
                            fVar85 * fVar134 + fVar107 * fVar93 + fVar115 * fVar100 +
                            fVar147 * fVar175 + fVar161 * fVar154 + fVar192 * fVar189;
              pfVar240[7] = fVar250 + fVar266 + fVar108 + fVar86 + fVar261;
              pfVar240[8] = fVar15 * fVar36 + fVar270 + fVar72 * fVar22 + fVar29 * fVar43 +
                            fVar101 * fVar79 + fVar109 * fVar87 + fVar116 * fVar94 +
                            fVar155 * fVar142 + fVar190 * fVar148 + fVar193 * fVar183;
              pfVar240[9] = fVar16 * fVar37 + fVar271 + fVar73 * fVar23 + fVar30 * fVar44 +
                            fVar102 * fVar80 + fVar110 * fVar88 + fVar258 * fVar95 +
                            fVar156 * fVar256 + fVar257 * fVar149 + fVar243 * fVar184;
              pfVar240[10] = fVar17 * fVar38 + fVar272 + fVar74 * fVar24 + fVar31 * fVar45 +
                             fVar103 * fVar81 + fVar111 * fVar89 + fVar260 * fVar96 +
                             fVar157 * fVar143 + fVar248 * fVar150 + fVar244 * fVar185;
              pfVar240[0xb] =
                   fVar18 * fVar39 + fVar273 + fVar75 * fVar25 + fVar32 * fVar46 +
                   fVar104 * fVar82 + fVar112 * fVar90 + fVar117 * fVar97 +
                   fVar158 * fVar144 + fVar255 * fVar151 + fVar246 * fVar186;
              pfVar240[0xc] =
                   fVar19 * fVar40 + fVar274 + fVar76 * fVar26 + fVar33 * fVar47 +
                   fVar105 * fVar83 + fVar113 * fVar91 + fVar118 * fVar98 +
                   fVar159 * fVar145 + fVar259 * fVar152 + fVar247 * fVar187;
              pfVar240[0xd] =
                   fVar20 * fVar41 + fVar275 + fVar77 * fVar27 + fVar34 * fVar48 +
                   fVar106 * fVar84 + fVar114 * fVar92 + fVar119 * fVar99 +
                   fVar160 * fVar146 + fVar191 * fVar153 + fVar249 * fVar188;
              pfVar240[0xe] =
                   fVar21 * fVar42 + fVar276 + fVar78 * fVar28 + fVar35 * fVar49 +
                   fVar107 * fVar85 + fVar115 * fVar93 + fVar120 * fVar100 +
                   fVar161 * fVar147 + fVar192 * fVar154 + fVar251 * fVar189;
              pfVar240[0xf] = fVar263 + fVar252 + fVar267 + fVar250 + in_register_000013dc;
              pfVar240[0x10] =
                   fVar22 * fVar36 + fVar270 + fVar72 * fVar29 + fVar65 * fVar43 +
                   fVar109 * fVar79 + fVar116 * fVar87 + fVar121 * fVar94 +
                   fVar190 * fVar142 + fVar193 * fVar148 + fVar162 * fVar183;
              pfVar240[0x11] =
                   fVar23 * fVar37 + fVar271 + fVar73 * fVar30 + fVar66 * fVar44 +
                   fVar110 * fVar80 + fVar258 * fVar88 + fVar122 * fVar95 +
                   fVar257 * fVar256 + fVar243 * fVar149 + fVar163 * fVar184;
              pfVar240[0x12] =
                   fVar24 * fVar38 + fVar272 + fVar74 * fVar31 + fVar67 * fVar45 +
                   fVar111 * fVar81 + fVar260 * fVar89 + fVar123 * fVar96 +
                   fVar248 * fVar143 + fVar244 * fVar150 + fVar164 * fVar185;
              pfVar240[0x13] =
                   fVar25 * fVar39 + fVar273 + fVar75 * fVar32 + fVar68 * fVar46 +
                   fVar112 * fVar82 + fVar117 * fVar90 + fVar124 * fVar97 +
                   fVar255 * fVar144 + fVar246 * fVar151 + fVar165 * fVar186;
              pfVar240[0x14] =
                   fVar26 * fVar40 + fVar274 + fVar76 * fVar33 + fVar69 * fVar47 +
                   fVar113 * fVar83 + fVar118 * fVar91 + fVar125 * fVar98 +
                   fVar259 * fVar145 + fVar247 * fVar152 + fVar254 * fVar187;
              pfVar240[0x15] =
                   fVar27 * fVar41 + fVar275 + fVar77 * fVar34 + fVar70 * fVar48 +
                   fVar114 * fVar84 + fVar119 * fVar92 + fVar268 * fVar99 +
                   fVar191 * fVar146 + fVar249 * fVar153 + fVar166 * fVar188;
              pfVar240[0x16] =
                   fVar28 * fVar42 + fVar276 + fVar78 * fVar35 + fVar71 * fVar49 +
                   fVar115 * fVar85 + fVar120 * fVar93 + fVar126 * fVar100 +
                   fVar192 * fVar147 + fVar251 * fVar154 + fVar167 * fVar189;
              pfVar240[0x17] =
                   fVar266 + in_register_0000155c + fVar50 + fVar269 + fVar127 +
                   in_register_0000151c + fVar168;
              pfVar240[0x18] =
                   fVar270 + fVar29 * fVar36 + fVar65 * fVar72 + fVar43 * fVar58 +
                   fVar94 * fVar135 + fVar116 * fVar79 + fVar121 * fVar87 +
                   fVar183 * fVar176 + fVar193 * fVar142 + fVar162 * fVar148;
              pfVar240[0x19] =
                   fVar271 + fVar30 * fVar37 + fVar66 * fVar73 + fVar44 * fVar59 +
                   fVar95 * fVar136 + fVar258 * fVar80 + fVar122 * fVar88 +
                   fVar184 * fVar177 + fVar243 * fVar256 + fVar163 * fVar149;
              pfVar240[0x1a] =
                   fVar272 + fVar31 * fVar38 + fVar67 * fVar74 + fVar45 * fVar60 +
                   fVar96 * fVar137 + fVar260 * fVar81 + fVar123 * fVar89 +
                   fVar185 * fVar178 + fVar244 * fVar143 + fVar164 * fVar150;
              pfVar240[0x1b] =
                   fVar273 + fVar32 * fVar39 + fVar68 * fVar75 + fVar46 * fVar61 +
                   fVar97 * fVar138 + fVar117 * fVar82 + fVar124 * fVar90 +
                   fVar186 * fVar179 + fVar246 * fVar144 + fVar165 * fVar151;
              pfVar240[0x1c] =
                   fVar274 + fVar33 * fVar40 + fVar69 * fVar76 + fVar47 * fVar62 +
                   fVar98 * fVar139 + fVar118 * fVar83 + fVar125 * fVar91 +
                   fVar187 * fVar180 + fVar247 * fVar145 + fVar254 * fVar152;
              pfVar240[0x1d] =
                   fVar275 + fVar34 * fVar41 + fVar70 * fVar77 + fVar48 * fVar63 +
                   fVar99 * fVar140 + fVar119 * fVar84 + fVar268 * fVar92 +
                   fVar188 * fVar181 + fVar249 * fVar146 + fVar166 * fVar153;
              pfVar240[0x1e] =
                   fVar276 + fVar35 * fVar42 + fVar71 * fVar78 + fVar49 * fVar64 +
                   fVar100 * fVar141 + fVar120 * fVar85 + fVar126 * fVar93 +
                   fVar189 * fVar182 + fVar251 * fVar147 + fVar167 * fVar154;
              pfVar240[0x1f] = in_register_000012dc;
              pfVar240 = pfVar240 + 0x20;
              iVar234 = iVar234 + 4;
              uVar238 = uVar12 & 0xfffffffc;
            } while (iVar234 < (int)uVar12);
          }
          if ((int)(uVar238 | 1) < (int)uVar12) {
            lVar235 = 0;
            uVar237 = uVar238;
            do {
              pfVar242 = (float *)((long)pfVar233 + lVar235 + 0x20);
              fVar15 = *pfVar242;
              fVar16 = pfVar242[1];
              fVar17 = pfVar242[2];
              fVar18 = pfVar242[3];
              fVar19 = pfVar242[4];
              fVar20 = pfVar242[5];
              fVar21 = pfVar242[6];
              fVar22 = pfVar242[7];
              pfVar242 = (float *)((long)pfVar233 + lVar235 + 0x40);
              fVar23 = *pfVar242;
              fVar24 = pfVar242[1];
              fVar25 = pfVar242[2];
              fVar26 = pfVar242[3];
              fVar27 = pfVar242[4];
              fVar28 = pfVar242[5];
              fVar29 = pfVar242[6];
              fVar30 = pfVar242[7];
              fVar31 = *pfVar241;
              fVar32 = pfVar241[1];
              fVar33 = pfVar241[2];
              fVar34 = pfVar241[3];
              fVar35 = pfVar241[4];
              fVar36 = pfVar241[5];
              fVar37 = pfVar241[6];
              fVar38 = pfVar241[7];
              fVar39 = pfVar241[8];
              fVar40 = pfVar241[9];
              fVar41 = pfVar241[10];
              fVar42 = pfVar241[0xb];
              fVar43 = pfVar241[0xc];
              fVar44 = pfVar241[0xd];
              fVar45 = pfVar241[0xe];
              fVar46 = pfVar241[0xf];
              fVar47 = pfVar241[0x10];
              fVar48 = pfVar241[0x11];
              fVar49 = pfVar241[0x12];
              fVar50 = pfVar241[0x13];
              fVar51 = pfVar241[0x14];
              fVar52 = pfVar241[0x15];
              fVar53 = pfVar241[0x16];
              pfVar4 = (float *)((long)pfVar233 + lVar235);
              fVar54 = pfVar4[1];
              fVar55 = pfVar4[2];
              fVar56 = pfVar4[3];
              fVar57 = pfVar4[4];
              fVar58 = pfVar4[5];
              fVar59 = pfVar4[6];
              fVar60 = pfVar241[0x18];
              fVar61 = pfVar241[0x19];
              fVar62 = pfVar241[0x1a];
              fVar63 = pfVar241[0x1b];
              fVar64 = pfVar241[0x1c];
              fVar65 = pfVar241[0x1d];
              fVar66 = pfVar241[0x1e];
              fVar67 = pfVar241[0x1f];
              fVar254 = fVar277 + in_register_0000135c;
              pfVar242 = (float *)((long)pfVar233 + lVar235 + 0x60);
              fVar68 = *pfVar242;
              fVar69 = pfVar242[1];
              fVar70 = pfVar242[2];
              fVar71 = pfVar242[3];
              fVar72 = pfVar242[4];
              fVar73 = pfVar242[5];
              fVar74 = pfVar242[6];
              fVar75 = pfVar241[0x20];
              fVar76 = pfVar241[0x21];
              fVar77 = pfVar241[0x22];
              fVar78 = pfVar241[0x23];
              fVar79 = pfVar241[0x24];
              fVar80 = pfVar241[0x25];
              fVar81 = pfVar241[0x26];
              fVar82 = pfVar241[0x27];
              fVar83 = pfVar241[0x28];
              fVar84 = pfVar241[0x29];
              fVar85 = pfVar241[0x2a];
              fVar86 = pfVar241[0x2b];
              fVar87 = pfVar241[0x2c];
              fVar88 = pfVar241[0x2d];
              fVar89 = pfVar241[0x2e];
              fVar90 = pfVar241[0x2f];
              pfVar242 = (float *)((long)pfVar229 + lVar235 + 0x20);
              fVar91 = *pfVar242;
              fVar92 = pfVar242[1];
              fVar93 = pfVar242[2];
              fVar94 = pfVar242[3];
              fVar95 = pfVar242[4];
              fVar96 = pfVar242[5];
              fVar97 = pfVar242[6];
              fVar98 = pfVar242[7];
              pfVar242 = (float *)((long)pfVar229 + lVar235 + 0x40);
              fVar99 = *pfVar242;
              fVar100 = pfVar242[1];
              fVar101 = pfVar242[2];
              fVar102 = pfVar242[3];
              fVar103 = pfVar242[4];
              fVar104 = pfVar242[5];
              fVar105 = pfVar242[6];
              fVar106 = pfVar242[7];
              pfVar242 = (float *)((long)pfVar229 + lVar235);
              fVar107 = pfVar242[1];
              fVar108 = pfVar242[2];
              fVar109 = pfVar242[3];
              fVar110 = pfVar242[4];
              fVar111 = pfVar242[5];
              fVar112 = pfVar242[6];
              pfVar2 = (float *)((long)pfVar229 + lVar235 + 0x60);
              fVar113 = *pfVar2;
              fVar114 = pfVar2[1];
              fVar115 = pfVar2[2];
              fVar116 = pfVar2[3];
              fVar258 = pfVar2[4];
              fVar260 = pfVar2[5];
              fVar117 = pfVar2[6];
              fVar118 = pfVar241[0x30];
              fVar119 = pfVar241[0x31];
              fVar120 = pfVar241[0x32];
              fVar121 = pfVar241[0x33];
              fVar122 = pfVar241[0x34];
              fVar123 = pfVar241[0x35];
              fVar124 = pfVar241[0x36];
              fVar125 = pfVar241[0x37];
              fVar268 = pfVar241[0x38];
              fVar126 = pfVar241[0x39];
              fVar127 = pfVar241[0x3a];
              fVar128 = pfVar241[0x3b];
              fVar129 = pfVar241[0x3c];
              fVar130 = pfVar241[0x3d];
              fVar131 = pfVar241[0x3e];
              fVar132 = pfVar241[0x3f];
              fVar133 = pfVar241[0x40];
              fVar134 = pfVar241[0x41];
              fVar135 = pfVar241[0x42];
              fVar136 = pfVar241[0x43];
              fVar137 = pfVar241[0x44];
              fVar138 = pfVar241[0x45];
              fVar139 = pfVar241[0x46];
              pfVar3 = (float *)((long)pfVar230 + lVar235 + 0x20);
              fVar140 = *pfVar3;
              fVar141 = pfVar3[1];
              fVar142 = pfVar3[2];
              fVar256 = pfVar3[3];
              fVar143 = pfVar3[4];
              fVar144 = pfVar3[5];
              fVar145 = pfVar3[6];
              pfVar2 = (float *)((long)pfVar230 + lVar235 + 0x40);
              fVar159 = *pfVar2;
              fVar160 = pfVar2[1];
              fVar161 = pfVar2[2];
              fVar162 = pfVar2[3];
              fVar163 = pfVar2[4];
              fVar164 = pfVar2[5];
              fVar165 = pfVar2[6];
              in_register_0000139c = pfVar2[7];
              pfVar2 = (float *)((long)pfVar230 + lVar235);
              fVar146 = pfVar2[1];
              fVar147 = pfVar2[2];
              fVar148 = pfVar2[3];
              fVar149 = pfVar2[4];
              fVar150 = pfVar2[5];
              fVar151 = pfVar2[6];
              in_register_0000135c = in_register_000013dc + pfVar3[7];
              in_register_000012dc = in_register_0000135c + fVar132;
              pfVar3 = (float *)((long)pfVar230 + lVar235 + 0x60);
              fVar152 = *pfVar3;
              fVar153 = pfVar3[1];
              fVar154 = pfVar3[2];
              fVar155 = pfVar3[3];
              fVar156 = pfVar3[4];
              fVar157 = pfVar3[5];
              fVar158 = pfVar3[6];
              pfVar3 = (float *)((long)pfVar240 + lVar235);
              *pfVar3 = fVar270 + fVar31 * *pfVar4 + fVar15 * fVar39 + fVar23 * fVar47 +
                        fVar60 * *pfVar242 + fVar91 * fVar75 + fVar99 * fVar83 +
                        fVar118 * *pfVar2 + fVar140 * fVar268 + fVar159 * fVar133;
              pfVar3[1] = fVar271 + fVar32 * fVar54 + fVar16 * fVar40 + fVar24 * fVar48 +
                          fVar61 * fVar107 + fVar92 * fVar76 + fVar100 * fVar84 +
                          fVar119 * fVar146 + fVar141 * fVar126 + fVar160 * fVar134;
              pfVar3[2] = fVar272 + fVar33 * fVar55 + fVar17 * fVar41 + fVar25 * fVar49 +
                          fVar62 * fVar108 + fVar93 * fVar77 + fVar101 * fVar85 +
                          fVar120 * fVar147 + fVar142 * fVar127 + fVar161 * fVar135;
              pfVar3[3] = fVar273 + fVar34 * fVar56 + fVar18 * fVar42 + fVar26 * fVar50 +
                          fVar63 * fVar109 + fVar94 * fVar78 + fVar102 * fVar86 +
                          fVar121 * fVar148 + fVar256 * fVar128 + fVar162 * fVar136;
              pfVar3[4] = fVar274 + fVar35 * fVar57 + fVar19 * fVar43 + fVar27 * fVar51 +
                          fVar64 * fVar110 + fVar95 * fVar79 + fVar103 * fVar87 +
                          fVar122 * fVar149 + fVar143 * fVar129 + fVar163 * fVar137;
              pfVar3[5] = fVar275 + fVar36 * fVar58 + fVar20 * fVar44 + fVar28 * fVar52 +
                          fVar65 * fVar111 + fVar96 * fVar80 + fVar104 * fVar88 +
                          fVar123 * fVar150 + fVar144 * fVar130 + fVar164 * fVar138;
              pfVar3[6] = fVar276 + fVar37 * fVar59 + fVar21 * fVar45 + fVar29 * fVar53 +
                          fVar66 * fVar112 + fVar97 * fVar81 + fVar105 * fVar89 +
                          fVar124 * fVar151 + fVar145 * fVar131 + fVar165 * fVar139;
              pfVar3[7] = fVar254 + fVar22 + fVar30 + in_register_000013dc + fVar98 + fVar106 +
                          in_register_000012dc;
              pfVar242 = (float *)((long)pfVar240 + lVar235 + 0x20);
              *pfVar242 = fVar270 + fVar15 * fVar31 + fVar23 * fVar39 + fVar47 * fVar68 +
                          fVar91 * fVar60 + fVar99 * fVar75 + fVar83 * fVar113 +
                          fVar140 * fVar118 + fVar159 * fVar268 + fVar133 * fVar152;
              pfVar242[1] = fVar271 + fVar16 * fVar32 + fVar24 * fVar40 + fVar48 * fVar69 +
                            fVar92 * fVar61 + fVar100 * fVar76 + fVar84 * fVar114 +
                            fVar141 * fVar119 + fVar160 * fVar126 + fVar134 * fVar153;
              pfVar242[2] = fVar272 + fVar17 * fVar33 + fVar25 * fVar41 + fVar49 * fVar70 +
                            fVar93 * fVar62 + fVar101 * fVar77 + fVar85 * fVar115 +
                            fVar142 * fVar120 + fVar161 * fVar127 + fVar135 * fVar154;
              pfVar242[3] = fVar273 + fVar18 * fVar34 + fVar26 * fVar42 + fVar50 * fVar71 +
                            fVar94 * fVar63 + fVar102 * fVar78 + fVar86 * fVar116 +
                            fVar256 * fVar121 + fVar162 * fVar128 + fVar136 * fVar155;
              pfVar242[4] = fVar274 + fVar19 * fVar35 + fVar27 * fVar43 + fVar51 * fVar72 +
                            fVar95 * fVar64 + fVar103 * fVar79 + fVar87 * fVar258 +
                            fVar143 * fVar122 + fVar163 * fVar129 + fVar137 * fVar156;
              pfVar242[5] = fVar275 + fVar20 * fVar36 + fVar28 * fVar44 + fVar52 * fVar73 +
                            fVar96 * fVar65 + fVar104 * fVar80 + fVar88 * fVar260 +
                            fVar144 * fVar123 + fVar164 * fVar130 + fVar138 * fVar157;
              pfVar242[6] = fVar276 + fVar21 * fVar37 + fVar29 * fVar45 + fVar53 * fVar74 +
                            fVar97 * fVar66 + fVar105 * fVar81 + fVar89 * fVar117 +
                            fVar145 * fVar124 + fVar165 * fVar131 + fVar139 * fVar158;
              pfVar242[7] = fVar277 + fVar38 + fVar46 + fVar30 + fVar67 + fVar82 + fVar90 +
                            fVar125 + fVar132 + in_register_000012dc;
              uVar238 = uVar237 + 2;
              lVar235 = lVar235 + 0x40;
              iVar234 = uVar237 + 3;
              uVar237 = uVar238;
            } while (iVar234 < (int)uVar12);
            pfVar240 = (float *)((long)pfVar240 + lVar235);
            pfVar233 = (float *)((long)pfVar233 + lVar235);
            pfVar229 = (float *)((long)pfVar229 + lVar235);
            pfVar230 = (float *)((long)pfVar230 + lVar235);
          }
          if ((int)uVar238 < (int)uVar12) {
            iVar234 = uVar12 - uVar238;
            lVar239 = 0x40;
            lVar235 = 0;
            do {
              pfVar3 = (float *)((long)pfVar233 + lVar239 + -0x40);
              fVar15 = pfVar3[1];
              fVar16 = pfVar3[2];
              fVar17 = pfVar3[3];
              fVar18 = pfVar3[4];
              fVar19 = pfVar3[5];
              fVar20 = pfVar3[6];
              fVar21 = pfVar3[7];
              pfVar4 = (float *)((long)pfVar233 + lVar239 + -0x20);
              fVar22 = pfVar4[1];
              fVar23 = pfVar4[2];
              fVar24 = pfVar4[3];
              fVar25 = pfVar4[4];
              fVar26 = pfVar4[5];
              fVar27 = pfVar4[6];
              fVar28 = pfVar4[7];
              fVar29 = pfVar241[1];
              fVar30 = pfVar241[2];
              fVar31 = pfVar241[3];
              fVar32 = pfVar241[4];
              fVar33 = pfVar241[5];
              fVar34 = pfVar241[6];
              pfVar9 = (float *)((long)pfVar233 + lVar239);
              fVar35 = pfVar9[1];
              fVar36 = pfVar9[2];
              fVar37 = pfVar9[3];
              fVar38 = pfVar9[4];
              fVar39 = pfVar9[5];
              fVar40 = pfVar9[6];
              fVar41 = pfVar9[7];
              fVar42 = pfVar241[9];
              fVar43 = pfVar241[10];
              fVar44 = pfVar241[0xb];
              fVar45 = pfVar241[0xc];
              fVar46 = pfVar241[0xd];
              fVar47 = pfVar241[0xe];
              fVar48 = pfVar241[0x11];
              fVar49 = pfVar241[0x12];
              fVar50 = pfVar241[0x13];
              fVar51 = pfVar241[0x14];
              fVar52 = pfVar241[0x15];
              fVar53 = pfVar241[0x16];
              pfVar5 = (float *)((long)pfVar229 + lVar239 + -0x40);
              fVar54 = pfVar5[1];
              fVar55 = pfVar5[2];
              fVar56 = pfVar5[3];
              fVar57 = pfVar5[4];
              fVar58 = pfVar5[5];
              fVar59 = pfVar5[6];
              fVar60 = pfVar5[7];
              pfVar8 = (float *)((long)pfVar229 + lVar239 + -0x20);
              fVar61 = pfVar8[1];
              fVar62 = pfVar8[2];
              fVar63 = pfVar8[3];
              fVar64 = pfVar8[4];
              fVar65 = pfVar8[5];
              fVar66 = pfVar8[6];
              fVar67 = pfVar8[7];
              fVar68 = pfVar241[0x19];
              fVar69 = pfVar241[0x1a];
              fVar70 = pfVar241[0x1b];
              fVar71 = pfVar241[0x1c];
              fVar72 = pfVar241[0x1d];
              fVar73 = pfVar241[0x1e];
              pfVar242 = (float *)((long)pfVar229 + lVar239);
              fVar74 = pfVar242[1];
              fVar75 = pfVar242[2];
              fVar76 = pfVar242[3];
              fVar77 = pfVar242[4];
              fVar78 = pfVar242[5];
              fVar79 = pfVar242[6];
              fVar80 = pfVar241[0x21];
              fVar81 = pfVar241[0x22];
              fVar82 = pfVar241[0x23];
              fVar83 = pfVar241[0x24];
              fVar84 = pfVar241[0x25];
              fVar85 = pfVar241[0x26];
              fVar86 = pfVar241[0x29];
              fVar87 = pfVar241[0x2a];
              fVar88 = pfVar241[0x2b];
              fVar89 = pfVar241[0x2c];
              fVar90 = pfVar241[0x2d];
              fVar91 = pfVar241[0x2e];
              pfVar10 = (float *)((long)pfVar230 + lVar239 + -0x40);
              fVar92 = pfVar10[1];
              fVar93 = pfVar10[2];
              fVar94 = pfVar10[3];
              fVar95 = pfVar10[4];
              fVar96 = pfVar10[5];
              fVar97 = pfVar10[6];
              fVar98 = pfVar10[7];
              pfVar6 = (float *)((long)pfVar230 + lVar239 + -0x20);
              fVar99 = pfVar6[1];
              fVar100 = pfVar6[2];
              fVar101 = pfVar6[3];
              fVar102 = pfVar6[4];
              fVar103 = pfVar6[5];
              fVar104 = pfVar6[6];
              fVar105 = pfVar6[7];
              fVar106 = pfVar241[0x31];
              fVar107 = pfVar241[0x32];
              fVar108 = pfVar241[0x33];
              fVar109 = pfVar241[0x34];
              fVar110 = pfVar241[0x35];
              fVar111 = pfVar241[0x36];
              pfVar2 = (float *)((long)pfVar230 + lVar239);
              fVar122 = pfVar2[1];
              fVar123 = pfVar2[2];
              fVar124 = pfVar2[3];
              fVar125 = pfVar2[4];
              fVar268 = pfVar2[5];
              fVar126 = pfVar2[6];
              in_register_000012dc = pfVar2[7];
              fVar112 = pfVar241[0x39];
              fVar113 = pfVar241[0x3a];
              fVar114 = pfVar241[0x3b];
              fVar115 = pfVar241[0x3c];
              fVar116 = pfVar241[0x3d];
              fVar258 = pfVar241[0x3e];
              fVar260 = pfVar241[0x41];
              fVar117 = pfVar241[0x42];
              fVar118 = pfVar241[0x43];
              fVar119 = pfVar241[0x44];
              fVar120 = pfVar241[0x45];
              fVar121 = pfVar241[0x46];
              pfVar7 = (float *)((long)pfVar240 + lVar239 + -0x40);
              *pfVar7 = fVar270 + *pfVar3 * *pfVar241 +
                        *pfVar4 * pfVar241[8] + *pfVar9 * pfVar241[0x10] +
                        *pfVar5 * pfVar241[0x18] + *pfVar8 * pfVar241[0x20] +
                        *pfVar242 * pfVar241[0x28] +
                        *pfVar10 * pfVar241[0x30] + *pfVar6 * pfVar241[0x38] +
                        *pfVar2 * pfVar241[0x40];
              pfVar7[1] = fVar271 + fVar15 * fVar29 + fVar22 * fVar42 + fVar35 * fVar48 +
                          fVar54 * fVar68 + fVar61 * fVar80 + fVar74 * fVar86 +
                          fVar92 * fVar106 + fVar99 * fVar112 + fVar122 * fVar260;
              pfVar7[2] = fVar272 + fVar16 * fVar30 + fVar23 * fVar43 + fVar36 * fVar49 +
                          fVar55 * fVar69 + fVar62 * fVar81 + fVar75 * fVar87 +
                          fVar93 * fVar107 + fVar100 * fVar113 + fVar123 * fVar117;
              pfVar7[3] = fVar273 + fVar17 * fVar31 + fVar24 * fVar44 + fVar37 * fVar50 +
                          fVar56 * fVar70 + fVar63 * fVar82 + fVar76 * fVar88 +
                          fVar94 * fVar108 + fVar101 * fVar114 + fVar124 * fVar118;
              pfVar7[4] = fVar274 + fVar18 * fVar32 + fVar25 * fVar45 + fVar38 * fVar51 +
                          fVar57 * fVar71 + fVar64 * fVar83 + fVar77 * fVar89 +
                          fVar95 * fVar109 + fVar102 * fVar115 + fVar125 * fVar119;
              pfVar7[5] = fVar275 + fVar19 * fVar33 + fVar26 * fVar46 + fVar39 * fVar52 +
                          fVar58 * fVar72 + fVar65 * fVar84 + fVar78 * fVar90 +
                          fVar96 * fVar110 + fVar103 * fVar116 + fVar268 * fVar120;
              pfVar7[6] = fVar276 + fVar20 * fVar34 + fVar27 * fVar47 + fVar40 * fVar53 +
                          fVar59 * fVar73 + fVar66 * fVar85 + fVar79 * fVar91 +
                          fVar97 * fVar111 + fVar104 * fVar258 + fVar126 * fVar121;
              pfVar7[7] = fVar277 + fVar21 + fVar28 + fVar41 + fVar60 + fVar67 + fVar67 +
                          fVar98 + fVar105 + fVar105;
              lVar235 = lVar235 + -0x20;
              lVar239 = lVar239 + 0x20;
              iVar234 = iVar234 + -1;
            } while (iVar234 != 0);
            pfVar240 = (float *)((long)pfVar240 - lVar235);
            pfVar233 = (float *)((long)pfVar233 - lVar235);
            pfVar229 = (float *)((long)pfVar229 - lVar235);
            pfVar230 = (float *)((long)pfVar230 - lVar235);
          }
          pfVar233 = pfVar233 + 0x10;
          pfVar229 = pfVar229 + 0x10;
          pfVar230 = pfVar230 + 0x10;
          uVar236 = uVar236 + 1;
        } while (uVar236 != uVar13);
      }
      lVar231 = lVar231 + 1;
    } while (lVar231 != iVar11);
  }
  return;
}

Assistant:

static void convdw3x3s1_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + g * 8) : _mm256_setzero_ps();

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);
        float* outptr1 = out.row(1);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);
        const float* r3 = img0.row(3);

        int i = 0;
        for (; i + 1 < outh; i += 2)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                __m256 _sum00 = _bias0;
                __m256 _sum01 = _bias0;
                __m256 _sum02 = _bias0;
                __m256 _sum03 = _bias0;
                __m256 _sum10 = _bias0;
                __m256 _sum11 = _bias0;
                __m256 _sum12 = _bias0;
                __m256 _sum13 = _bias0;

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);
                __m256 _r03 = _mm256_load_ps(r0 + 24);
                __m256 _r04 = _mm256_load_ps(r0 + 32);
                __m256 _r05 = _mm256_load_ps(r0 + 40);

                _sum00 = _mm256_comp_fmadd_ps(_k00, _r00, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k00, _r01, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k00, _r02, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k00, _r03, _sum03);
                _sum00 = _mm256_comp_fmadd_ps(_k01, _r01, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k01, _r02, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k01, _r03, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k01, _r04, _sum03);
                _sum00 = _mm256_comp_fmadd_ps(_k02, _r02, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k02, _r03, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k02, _r04, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k02, _r05, _sum03);

                __m256 _k10 = _mm256_load_ps(k0 + 24);
                __m256 _k11 = _mm256_load_ps(k0 + 32);
                __m256 _k12 = _mm256_load_ps(k0 + 40);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);
                __m256 _r13 = _mm256_load_ps(r1 + 24);
                __m256 _r14 = _mm256_load_ps(r1 + 32);
                __m256 _r15 = _mm256_load_ps(r1 + 40);

                _sum10 = _mm256_comp_fmadd_ps(_k00, _r10, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k00, _r11, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k00, _r12, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k00, _r13, _sum13);
                _sum00 = _mm256_comp_fmadd_ps(_k10, _r10, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k10, _r11, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k10, _r12, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k10, _r13, _sum03);

                _sum10 = _mm256_comp_fmadd_ps(_k01, _r11, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k01, _r12, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k01, _r13, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k01, _r14, _sum13);
                _sum00 = _mm256_comp_fmadd_ps(_k11, _r11, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k11, _r12, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k11, _r13, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k11, _r14, _sum03);

                _sum10 = _mm256_comp_fmadd_ps(_k02, _r12, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k02, _r13, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k02, _r14, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k02, _r15, _sum13);
                _sum00 = _mm256_comp_fmadd_ps(_k12, _r12, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k12, _r13, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k12, _r14, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k12, _r15, _sum03);

                __m256 _k20 = _mm256_load_ps(k0 + 48);
                __m256 _k21 = _mm256_load_ps(k0 + 56);
                __m256 _k22 = _mm256_load_ps(k0 + 64);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);
                __m256 _r23 = _mm256_load_ps(r2 + 24);
                __m256 _r24 = _mm256_load_ps(r2 + 32);
                __m256 _r25 = _mm256_load_ps(r2 + 40);

                _sum10 = _mm256_comp_fmadd_ps(_k10, _r20, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k10, _r21, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k10, _r22, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k10, _r23, _sum13);
                _sum00 = _mm256_comp_fmadd_ps(_k20, _r20, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k20, _r21, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k20, _r22, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k20, _r23, _sum03);

                _sum10 = _mm256_comp_fmadd_ps(_k11, _r21, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k11, _r22, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k11, _r23, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k11, _r24, _sum13);
                _sum00 = _mm256_comp_fmadd_ps(_k21, _r21, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k21, _r22, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k21, _r23, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k21, _r24, _sum03);

                _sum10 = _mm256_comp_fmadd_ps(_k12, _r22, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k12, _r23, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k12, _r24, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k12, _r25, _sum13);
                _sum00 = _mm256_comp_fmadd_ps(_k22, _r22, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k22, _r23, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k22, _r24, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k22, _r25, _sum03);

                __m256 _r30 = _mm256_load_ps(r3);
                __m256 _r31 = _mm256_load_ps(r3 + 8);
                __m256 _r32 = _mm256_load_ps(r3 + 16);
                __m256 _r33 = _mm256_load_ps(r3 + 24);
                __m256 _r34 = _mm256_load_ps(r3 + 32);
                __m256 _r35 = _mm256_load_ps(r3 + 40);

                _sum10 = _mm256_comp_fmadd_ps(_k20, _r30, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k20, _r31, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k20, _r32, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k20, _r33, _sum13);
                _sum10 = _mm256_comp_fmadd_ps(_k21, _r31, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k21, _r32, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k21, _r33, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k21, _r34, _sum13);
                _sum10 = _mm256_comp_fmadd_ps(_k22, _r32, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k22, _r33, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k22, _r34, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k22, _r35, _sum13);

                _mm256_store_ps(outptr0, _sum00);
                _mm256_store_ps(outptr0 + 8, _sum01);
                _mm256_store_ps(outptr0 + 16, _sum02);
                _mm256_store_ps(outptr0 + 24, _sum03);
                _mm256_store_ps(outptr1, _sum10);
                _mm256_store_ps(outptr1 + 8, _sum11);
                _mm256_store_ps(outptr1 + 16, _sum12);
                _mm256_store_ps(outptr1 + 24, _sum13);

                r0 += 32;
                r1 += 32;
                r2 += 32;
                r3 += 32;
                outptr0 += 32;
                outptr1 += 32;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m256 _sum00 = _bias0;
                __m256 _sum01 = _bias0;
                __m256 _sum10 = _bias0;
                __m256 _sum11 = _bias0;

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);
                __m256 _r03 = _mm256_load_ps(r0 + 24);

                _sum00 = _mm256_comp_fmadd_ps(_k00, _r00, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k00, _r01, _sum01);
                _sum00 = _mm256_comp_fmadd_ps(_k01, _r01, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k01, _r02, _sum01);
                _sum00 = _mm256_comp_fmadd_ps(_k02, _r02, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k02, _r03, _sum01);

                __m256 _k10 = _mm256_load_ps(k0 + 24);
                __m256 _k11 = _mm256_load_ps(k0 + 32);
                __m256 _k12 = _mm256_load_ps(k0 + 40);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);
                __m256 _r13 = _mm256_load_ps(r1 + 24);

                _sum00 = _mm256_comp_fmadd_ps(_k10, _r10, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k10, _r11, _sum01);
                _sum10 = _mm256_comp_fmadd_ps(_k00, _r10, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k00, _r11, _sum11);

                _sum00 = _mm256_comp_fmadd_ps(_k11, _r11, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k11, _r12, _sum01);
                _sum10 = _mm256_comp_fmadd_ps(_k01, _r11, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k01, _r12, _sum11);

                _sum00 = _mm256_comp_fmadd_ps(_k12, _r12, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k12, _r13, _sum01);
                _sum10 = _mm256_comp_fmadd_ps(_k02, _r12, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k02, _r13, _sum11);

                __m256 _k20 = _mm256_load_ps(k0 + 48);
                __m256 _k21 = _mm256_load_ps(k0 + 56);
                __m256 _k22 = _mm256_load_ps(k0 + 64);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);
                __m256 _r23 = _mm256_load_ps(r2 + 24);

                _sum00 = _mm256_comp_fmadd_ps(_k20, _r20, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k20, _r21, _sum01);
                _sum10 = _mm256_comp_fmadd_ps(_k10, _r20, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k10, _r21, _sum11);

                _sum00 = _mm256_comp_fmadd_ps(_k21, _r21, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k21, _r22, _sum01);
                _sum10 = _mm256_comp_fmadd_ps(_k11, _r21, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k11, _r22, _sum11);

                _sum00 = _mm256_comp_fmadd_ps(_k22, _r22, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k22, _r23, _sum01);
                _sum10 = _mm256_comp_fmadd_ps(_k12, _r22, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k12, _r23, _sum11);

                __m256 _r30 = _mm256_load_ps(r3);
                __m256 _r31 = _mm256_load_ps(r3 + 8);
                __m256 _r32 = _mm256_load_ps(r3 + 16);
                __m256 _r33 = _mm256_load_ps(r3 + 24);

                _sum10 = _mm256_comp_fmadd_ps(_k20, _r30, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k20, _r31, _sum11);
                _sum10 = _mm256_comp_fmadd_ps(_k21, _r31, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k21, _r32, _sum11);
                _sum10 = _mm256_comp_fmadd_ps(_k22, _r32, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k22, _r33, _sum11);

                _mm256_store_ps(outptr0, _sum00);
                _mm256_store_ps(outptr0 + 8, _sum01);
                _mm256_store_ps(outptr1, _sum10);
                _mm256_store_ps(outptr1 + 8, _sum11);

                r0 += 16;
                r1 += 16;
                r2 += 16;
                r3 += 16;
                outptr0 += 16;
                outptr1 += 16;
            }
            for (; j < outw; j++)
            {
                __m256 _sum0 = _bias0;
                __m256 _sum1 = _bias0;

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);

                __m256 _k10 = _mm256_load_ps(k0 + 24);
                __m256 _k11 = _mm256_load_ps(k0 + 32);
                __m256 _k12 = _mm256_load_ps(k0 + 40);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k00, _r10, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r11, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r12, _sum1);

                __m256 _k20 = _mm256_load_ps(k0 + 48);
                __m256 _k21 = _mm256_load_ps(k0 + 56);
                __m256 _k22 = _mm256_load_ps(k0 + 64);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r20, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r21, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r22, _sum1);

                __m256 _r30 = _mm256_load_ps(r3);
                __m256 _r31 = _mm256_load_ps(r3 + 8);
                __m256 _r32 = _mm256_load_ps(r3 + 16);

                _sum1 = _mm256_comp_fmadd_ps(_k20, _r30, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r31, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r32, _sum1);

                _mm256_store_ps(outptr0, _sum0);
                _mm256_store_ps(outptr1, _sum1);

                r0 += 8;
                r1 += 8;
                r2 += 8;
                r3 += 8;
                outptr0 += 8;
                outptr1 += 8;
            }

            r0 += 2 * 8 + w * 8;
            r1 += 2 * 8 + w * 8;
            r2 += 2 * 8 + w * 8;
            r3 += 2 * 8 + w * 8;

            outptr0 += outw * 8;
            outptr1 += outw * 8;
        }
        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                __m256 _sum0 = _bias0;
                __m256 _sum1 = _bias0;
                __m256 _sum2 = _bias0;
                __m256 _sum3 = _bias0;

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);
                __m256 _r03 = _mm256_load_ps(r0 + 24);
                __m256 _r04 = _mm256_load_ps(r0 + 32);
                __m256 _r05 = _mm256_load_ps(r0 + 40);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k00, _r02, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k00, _r03, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k01, _r03, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k01, _r04, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k02, _r04, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k02, _r05, _sum3);

                __m256 _k10 = _mm256_load_ps(k0 + 24);
                __m256 _k11 = _mm256_load_ps(k0 + 32);
                __m256 _k12 = _mm256_load_ps(k0 + 40);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);
                __m256 _r13 = _mm256_load_ps(r1 + 24);
                __m256 _r14 = _mm256_load_ps(r1 + 32);
                __m256 _r15 = _mm256_load_ps(r1 + 40);

                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k10, _r12, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k10, _r13, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k11, _r13, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k11, _r14, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k12, _r14, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k12, _r15, _sum3);

                __m256 _k20 = _mm256_load_ps(k0 + 48);
                __m256 _k21 = _mm256_load_ps(k0 + 56);
                __m256 _k22 = _mm256_load_ps(k0 + 64);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);
                __m256 _r23 = _mm256_load_ps(r2 + 24);
                __m256 _r24 = _mm256_load_ps(r2 + 32);
                __m256 _r25 = _mm256_load_ps(r2 + 40);

                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k20, _r22, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k20, _r23, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k21, _r23, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k21, _r24, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r23, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k22, _r24, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k22, _r25, _sum3);

                _mm256_store_ps(outptr0, _sum0);
                _mm256_store_ps(outptr0 + 8, _sum1);
                _mm256_store_ps(outptr0 + 16, _sum2);
                _mm256_store_ps(outptr0 + 24, _sum3);

                r0 += 32;
                r1 += 32;
                r2 += 32;
                outptr0 += 32;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m256 _sum0 = _bias0;
                __m256 _sum1 = _bias0;

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);
                __m256 _r03 = _mm256_load_ps(r0 + 24);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r03, _sum1);

                __m256 _k10 = _mm256_load_ps(k0 + 24);
                __m256 _k11 = _mm256_load_ps(k0 + 32);
                __m256 _k12 = _mm256_load_ps(k0 + 40);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);
                __m256 _r13 = _mm256_load_ps(r1 + 24);

                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r13, _sum1);

                __m256 _k20 = _mm256_load_ps(k0 + 48);
                __m256 _k21 = _mm256_load_ps(k0 + 56);
                __m256 _k22 = _mm256_load_ps(k0 + 64);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);
                __m256 _r23 = _mm256_load_ps(r2 + 24);

                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r23, _sum1);

                _mm256_store_ps(outptr0, _sum0);
                _mm256_store_ps(outptr0 + 8, _sum1);

                r0 += 16;
                r1 += 16;
                r2 += 16;
                outptr0 += 16;
            }
            for (; j < outw; j++)
            {
                __m256 _sum0 = _bias0;

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);

                __m256 _k10 = _mm256_load_ps(k0 + 24);
                __m256 _k11 = _mm256_load_ps(k0 + 32);
                __m256 _k12 = _mm256_load_ps(k0 + 40);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);

                __m256 _k20 = _mm256_load_ps(k0 + 48);
                __m256 _k21 = _mm256_load_ps(k0 + 56);
                __m256 _k22 = _mm256_load_ps(k0 + 64);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                _mm256_store_ps(outptr0, _sum0);

                r0 += 8;
                r1 += 8;
                r2 += 8;
                outptr0 += 8;
            }

            r0 += 2 * 8;
            r1 += 2 * 8;
            r2 += 2 * 8;
        }
    }
}